

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::SimpleVolPathIntegrator::Li
          (SimpleVolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *buf,VisibleSurface *param_5)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar9;
  Interval IVar10;
  pointer pLVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  short sVar83;
  Point3f p;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  array<float,_4> aVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint64_t uVar99;
  ulong uVar100;
  undefined4 extraout_var;
  byte bVar101;
  char cVar102;
  ulong uVar103;
  SampledWavelengths *pSVar104;
  undefined8 *puVar105;
  DebugMLTSampler *this_00;
  int iVar106;
  long lVar107;
  int iVar108;
  float *pfVar109;
  int *piVar110;
  ImageInfiniteLight *this_01;
  int *piVar111;
  uint uVar112;
  Vector3f *pVVar113;
  float *pfVar114;
  Ray *pRVar115;
  Ray *pRVar116;
  uintptr_t iptr;
  DenselySampledSpectrum *this_02;
  PrimitiveHandle *this_03;
  LightHandle *light;
  pointer pLVar117;
  long in_FS_OFFSET;
  bool bVar118;
  int iVar119;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  Float FVar129;
  float fVar130;
  float fVar131;
  float fVar167;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  Tuple2<pbrt::Point2,_float> u2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar153 [64];
  undefined8 uVar168;
  undefined1 auVar170 [56];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar136 [16];
  undefined8 uVar169;
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar150 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar151 [32];
  undefined1 extraout_var_00 [12];
  undefined1 auVar161 [64];
  undefined1 auVar152 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar166 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined8 uVar227;
  undefined1 auVar215 [64];
  undefined1 auVar204 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar222 [64];
  undefined1 auVar209 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  Float t0;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar268;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [64];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 in_ZMM13 [64];
  undefined1 in_XMM15 [16];
  Point3f p_00;
  Vector3f w;
  Vector3f woRender;
  SampledSpectrum SVar284;
  bool terminated;
  bool scattered;
  Float nextCrossingT [3];
  int voxel [3];
  Float uMode;
  int numScatters;
  RNG rng;
  int step [3];
  Float deltaT [3];
  int voxelLimit [3];
  SampledSpectrum beta;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  bool local_87e;
  bool local_87d;
  float local_87c;
  undefined1 local_878 [16];
  Point3f local_860;
  float local_854 [3];
  Ray local_848;
  undefined8 local_820;
  int local_814 [3];
  undefined1 local_808 [16];
  undefined1 local_7f8 [8];
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [8];
  undefined8 uStack_7e0;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  Float local_7c0;
  int local_7bc;
  PrimitiveHandle *local_7b8;
  float local_7ac;
  undefined1 local_7a8 [16];
  RNG local_790;
  SampledWavelengths *local_780;
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  SimpleVolPathIntegrator *local_750;
  undefined1 local_748 [20];
  float fStack_734;
  Float FStack_730;
  MediumHandle local_728;
  int aiStack_720 [3];
  float afStack_714 [3];
  SampledSpectrum local_708;
  undefined1 local_6f8 [8];
  float fStack_6f0;
  float fStack_6ec;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [8];
  undefined8 uStack_6d0;
  undefined1 local_6c8 [8];
  undefined8 uStack_6c0;
  undefined1 local_6b8 [8];
  undefined8 uStack_6b0;
  undefined1 local_6a0 [44];
  bool bStack_674;
  SimpleVolPathIntegrator *local_670;
  RayDifferential *local_668;
  Interval *local_660;
  bool *local_658;
  RNG *local_650;
  undefined1 local_648 [32];
  undefined1 local_628 [16];
  RayDifferential *local_618;
  Interval *local_610;
  int aiStack_604 [3];
  undefined1 local_5f8 [16];
  SampledSpectrum local_5e8;
  undefined1 local_5d0 [56];
  float local_598;
  MediumInterface *local_590;
  MediumHandle local_588;
  PhaseFunctionHandle local_580;
  undefined1 local_578 [32];
  undefined1 local_558 [32];
  SampledSpectrum local_538;
  undefined1 local_528 [16];
  Interval local_518;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  ScratchBuffer *local_4d0;
  float local_4c8 [4];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float local_498 [4];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float local_468 [4];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_328;
  ulong local_228;
  float local_218 [4];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [32];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 auVar120 [16];
  undefined1 auVar158 [64];
  undefined1 auVar162 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar218 [64];
  undefined1 auVar223 [64];
  undefined1 auVar228 [56];
  
  local_708.values.values[0] = 0.0;
  local_708.values.values[1] = 0.0;
  local_708.values.values[2] = 0.0;
  local_708.values.values[3] = 0.0;
  local_7d8 = 0x3f800000;
  uStack_7d4 = 0x3f800000;
  uStack_7d0 = 0x3f800000;
  uStack_7cc = 0x3f800000;
  local_5e8.values.values[0] = 1.0;
  local_5e8.values.values[1] = 1.0;
  local_5e8.values.values[2] = 1.0;
  local_5e8.values.values[3] = 1.0;
  local_7bc = 0;
  fVar130 = (lambda->pdf).values[1];
  auVar210 = ZEXT464((uint)fVar130);
  local_3e8 = ZEXT832(0) << 0x20;
  if ((fVar130 == 0.0) && (!NAN(fVar130))) {
    uVar100 = 0;
    while (uVar100 != 2) {
      fVar130 = (lambda->pdf).values[uVar100 + 2];
      auVar210 = ZEXT464((uint)fVar130);
      uVar100 = uVar100 + 1;
      if ((fVar130 != 0.0) || (NAN(fVar130))) goto LAB_003f53c1;
    }
    uVar100 = 3;
LAB_003f53c1:
    if (2 < uVar100) goto LAB_003f53eb;
  }
  (lambda->pdf).values[3] = 0.0;
  (lambda->pdf).values[1] = 0.0;
  (lambda->pdf).values[2] = 0.0;
  fVar130 = (lambda->pdf).values[0] * 0.25;
  local_3e8 = ZEXT432((uint)fVar130);
  (lambda->pdf).values[0] = fVar130;
LAB_003f53eb:
  this_03 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_7b8 = this_03;
  local_780 = lambda;
  local_750 = this;
  local_618 = ray;
  local_610 = (Interval *)sampler;
  local_4d0 = buf;
  local_3c8 = local_3e8;
  local_3a8 = local_3e8;
  local_1e8 = local_3e8;
  do {
    pSVar104 = local_780;
    local_648 = auVar210._0_32_;
    *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    if (((this_03->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      auVar210 = ZEXT1664((undefined1  [16])0x0);
      local_328._192_64_ = vmovdqu64_avx512f(auVar210);
      local_328._128_64_ = vmovdqu64_avx512f(auVar210);
      local_328._64_64_ = vmovdqu64_avx512f(auVar210);
      local_328._0_64_ = vmovdqu64_avx512f(auVar210);
      local_228 = 0;
    }
    else {
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_328.__align,this_03,&ray->super_Ray,
                 INFINITY);
    }
    local_87d = false;
    local_87e = false;
    if (((ray->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) == 0) {
LAB_003f8887:
      auVar210 = ZEXT3264(local_648);
    }
    else {
      local_5d0._0_8_ = *sampler;
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      FVar129 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)local_6a0,local_5d0,(ulong)local_5d0._0_8_ >> 0x30);
      local_878._0_4_ = FVar129;
      local_5d0._0_8_ = *sampler;
      FVar129 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)local_6a0,local_5d0,(ulong)local_5d0._0_8_ >> 0x30);
      uVar100 = (CONCAT44(extraout_var,local_878._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar103 = (uVar100 >> 0x2f ^ uVar100) * -0x395b586ca42e166b;
      uVar100 = uVar103 >> 0x2f ^ uVar103;
      uVar103 = (CONCAT44((int)(uVar103 >> 0x20),FVar129) ^ 0x1a929e4d6f47a654) *
                -0x395b586ca42e166b;
      uVar103 = (uVar103 >> 0x2f ^ uVar103) * -0x395b586ca42e166b;
      local_790.inc = uVar100 * 2 + 1;
      local_790.state =
           ((uVar103 >> 0x2f ^ uVar103) + 1) * 0x5851f42d4c957f2d + uVar100 * -0x4f5c17a566d501a4 +
           1;
      local_878 = ZEXT416((uint)((byte)local_228 & 1) * local_328._248_4_ +
                          (uint)!(bool)((byte)local_228 & 1) * 0x7f800000);
      local_5d0._0_8_ = *sampler;
      FVar129 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)local_6a0,local_5d0,(ulong)local_5d0._0_8_ >> 0x30);
      local_7a8._0_4_ = FVar129;
      local_5d0._0_8_ = *(Interval *)sampler;
      local_7c0 = DispatchSplit<9>::operator()
                            ((DispatchSplit<9> *)local_6a0,local_5d0,
                             (ulong)*(Interval *)sampler >> 0x30);
      uVar5 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
      uVar7 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar122._4_4_ = uVar7;
      auVar122._0_4_ = uVar5;
      auVar122._8_8_ = 0;
      fVar130 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      uVar100._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar100._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uVar100;
      uVar103 = *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uVar103;
      TVar9.bits = (ray->super_Ray).medium.
                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   .bits;
      sVar83 = (short)(TVar9.bits >> 0x30);
      local_6a0._24_8_ = pSVar104;
      local_670 = this;
      local_668 = ray;
      local_660 = (Interval *)sampler;
      if (TVar9.bits < (float **)0x3000000000000) {
        if (sVar83 != 2) {
          local_6a0._0_8_ = &local_7c0;
          local_6a0._8_8_ = &local_708;
          local_6a0._16_8_ = &local_5e8;
          local_6a0._32_8_ = &local_87e;
          unique0x00005300 = &local_7bc;
          local_658 = &local_87d;
          local_650 = &local_790;
          auVar132._0_4_ = (float)(undefined4)uVar100 * (float)(undefined4)uVar100;
          auVar132._4_4_ = (float)uVar100._4_4_ * (float)uVar100._4_4_;
          auVar132._8_8_ = 0;
          fVar229 = (float)uVar103;
          auVar136 = vhaddps_avx(auVar132,auVar132);
          fVar229 = fVar229 * fVar229 + auVar136._0_4_;
          local_778._0_4_ = fVar130;
          local_768 = auVar128;
          local_628 = auVar122;
          local_528 = auVar120;
          if (fVar229 < 0.0) {
            local_7f8._0_4_ = fVar229;
            fVar130 = sqrtf(fVar229);
            fVar229 = (float)local_7f8._0_4_;
          }
          else {
            auVar128 = vsqrtss_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229));
            fVar130 = auVar128._0_4_;
          }
          auVar228 = (undefined1  [56])0x0;
          local_808._0_4_ = fVar130;
          if (fVar229 < 0.0) {
            auVar228 = (undefined1  [56])0x0;
            auVar153._0_4_ = sqrtf(fVar229);
            auVar153._4_60_ = extraout_var_01;
            local_5f8 = auVar153._0_16_;
          }
          else {
            local_5f8 = vsqrtss_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229));
          }
          this_02 = (DenselySampledSpectrum *)(TVar9.bits & 0xffffffffffff);
          uVar168 = 0;
          _local_7f8 = ZEXT416((uint)this_02[3].lambda_min);
          SVar284 = DenselySampledSpectrum::Sample(this_02,pSVar104);
          auVar211._0_8_ = SVar284.values.values._8_8_;
          auVar211._8_56_ = auVar228;
          uStack_7e0 = uVar168;
          local_7e8 = (undefined1  [8])SVar284.values.values._0_8_;
          local_6e8 = auVar211._0_16_;
          auVar170 = (undefined1  [56])0x0;
          _local_6f8 = ZEXT416((uint)this_02[3].lambda_min);
          SVar284 = DenselySampledSpectrum::Sample(this_02 + 1,pSVar104);
          auVar212._0_8_ = SVar284.values.values._8_8_;
          auVar212._8_56_ = auVar228;
          auVar154._0_8_ = SVar284.values.values._0_8_;
          auVar154._8_56_ = auVar170;
          auVar128 = vunpcklpd_avx(_local_7e8,local_6e8);
          local_428 = (float)local_7f8._0_4_ * auVar128._0_4_;
          fStack_424 = (float)local_7f8._0_4_ * auVar128._4_4_;
          fStack_420 = (float)local_7f8._0_4_ * auVar128._8_4_;
          fStack_41c = (float)local_7f8._0_4_ * auVar128._12_4_;
          auVar128 = vmovlhps_avx(auVar154._0_16_,auVar212._0_16_);
          local_438 = (float)local_6f8._0_4_ * auVar128._0_4_;
          fStack_434 = (float)local_6f8._0_4_ * auVar128._4_4_;
          fStack_430 = (float)local_6f8._0_4_ * auVar128._8_4_;
          fStack_42c = (float)local_6f8._0_4_ * auVar128._12_4_;
          auVar173._0_4_ = local_438 + local_428;
          auVar173._4_4_ = fStack_434 + fStack_424;
          auVar173._8_4_ = fStack_430 + fStack_420;
          auVar173._12_4_ = fStack_42c + fStack_41c;
          auVar210 = ZEXT1664(auVar173);
          bVar118 = ABS((float)local_808._0_4_ * (float)local_878._0_4_) == INFINITY;
          uVar112 = (uint)bVar118 * 0x7f7fffff +
                    (uint)!bVar118 * (int)((float)local_808._0_4_ * (float)local_878._0_4_);
          if ((auVar173._0_4_ != 0.0) || (NAN(auVar173._0_4_))) {
            local_648 = ZEXT1632(auVar173);
            local_878 = ZEXT416(uVar112);
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            fVar130 = logf(1.0 - (float)local_7a8._0_4_);
            fVar229 = local_648._0_4_;
            fVar130 = -fVar130 / fVar229;
            fVar131 = local_878._0_4_;
            if (fVar130 < fVar131) {
              local_878._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar130) ^ 0x8000000000000000;
              local_878._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
              local_878._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
              local_208._0_4_ = fVar229 * -fVar130;
              local_208._4_4_ = local_648._4_4_ * -fVar130;
              local_208._8_4_ = local_648._8_4_ * -fVar130;
              local_208._12_4_ = local_648._12_4_ * -fVar130;
              auVar35._8_4_ = 0x3fb8aa3b;
              auVar35._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar35._12_4_ = 0x3fb8aa3b;
              auVar128 = vmulps_avx512vl(local_208,auVar35);
              _local_7f8 = vroundps_avx(auVar128,9);
              auVar128 = vsubps_avx(auVar128,_local_7f8);
              auVar199._8_4_ = 0x3da00ac9;
              auVar199._0_8_ = 0x3da00ac93da00ac9;
              auVar199._12_4_ = 0x3da00ac9;
              auVar36._8_4_ = 0x3e679a0b;
              auVar36._0_8_ = 0x3e679a0b3e679a0b;
              auVar36._12_4_ = 0x3e679a0b;
              auVar122 = vfmadd213ps_avx512vl(auVar199,auVar128,auVar36);
              auVar37._8_4_ = 0x3f321004;
              auVar37._0_8_ = 0x3f3210043f321004;
              auVar37._12_4_ = 0x3f321004;
              auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar37);
              auVar93._4_4_ = uStack_7d4;
              auVar93._0_4_ = local_7d8;
              auVar93._8_4_ = uStack_7d0;
              auVar93._12_4_ = uStack_7cc;
              local_808 = vfmadd213ps_fma(auVar122,auVar128,auVar93);
              local_7a8 = ZEXT416((uint)this_02[3].lambda_max);
              auVar228 = ZEXT856(0);
              auVar170 = ZEXT856(local_808._8_8_);
              auVar239 = in_ZMM13._0_16_;
              SVar284 = DenselySampledSpectrum::Sample(this_02 + 2,pSVar104);
              auVar222._0_8_ = SVar284.values.values._8_8_;
              auVar222._8_56_ = auVar170;
              auVar161._0_8_ = SVar284.values.values._0_8_;
              auVar161._8_56_ = auVar228;
              auVar95._4_4_ = fStack_424;
              auVar95._0_4_ = local_428;
              auVar95._8_4_ = fStack_420;
              auVar95._12_4_ = fStack_41c;
              auVar136 = vshufpd_avx(auVar95,auVar95,1);
              auVar253._4_4_ = local_5f8._0_4_;
              auVar253._0_4_ = local_5f8._0_4_;
              auVar253._8_4_ = local_5f8._0_4_;
              auVar253._12_4_ = local_5f8._0_4_;
              auVar128 = vdivps_avx(local_528,auVar253);
              local_5d0._36_4_ = local_768._0_4_ / (float)local_5f8._0_4_;
              auVar191 = local_648._0_16_;
              auVar237 = vshufpd_avx(auVar191,auVar191,1);
              auVar267._0_4_ = (int)(float)local_7f8._0_4_;
              auVar267._4_4_ = (int)(float)local_7f8._4_4_;
              auVar267._8_4_ = (int)fStack_7f0;
              auVar267._12_4_ = (int)fStack_7ec;
              auVar120 = vpsrld_avx(local_808,0x17);
              auVar279._8_4_ = 0xffffff81;
              auVar279._0_8_ = 0xffffff81ffffff81;
              auVar279._12_4_ = 0xffffff81;
              auVar122 = vpaddd_avx(auVar279,auVar267);
              auVar122 = vpaddd_avx(auVar122,auVar120);
              uVar100 = vpcmpgtd_avx512vl(auVar122,auVar279);
              uVar100 = uVar100 & 0xf;
              auVar38._8_4_ = 0x7f;
              auVar38._0_8_ = 0x7f0000007f;
              auVar38._12_4_ = 0x7f;
              uVar103 = vpcmpgtd_avx512vl(auVar122,auVar38);
              uVar103 = uVar103 & 0xf;
              auVar39._8_4_ = 0x807fffff;
              auVar39._0_8_ = 0x807fffff807fffff;
              auVar39._12_4_ = 0x807fffff;
              auVar120 = vpandd_avx512vl(local_808,auVar39);
              auVar122 = vpslld_avx(auVar122,0x17);
              auVar40._8_4_ = 0x3f800000;
              auVar40._0_8_ = 0x3f8000003f800000;
              auVar40._12_4_ = 0x3f800000;
              auVar122 = vpaddd_avx512vl(auVar122,auVar40);
              auVar122 = vpord_avx512vl(auVar122,auVar120);
              auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar118 = (bool)((byte)uVar103 & 1);
              local_538.values.values[0] =
                   (float)((uint)bVar118 * auVar120._0_4_ |
                          (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar122._0_4_);
              bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
              local_538.values.values[1] =
                   (float)((uint)bVar118 * auVar120._4_4_ |
                          (uint)!bVar118 * (uint)((byte)(uVar100 >> 1) & 1) * auVar122._4_4_);
              bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
              local_538.values.values[2] =
                   (float)((uint)bVar118 * auVar120._8_4_ |
                          (uint)!bVar118 * (uint)((byte)(uVar100 >> 2) & 1) * auVar122._8_4_);
              bVar118 = SUB81(uVar103 >> 3,0);
              local_538.values.values[3] =
                   (float)((uint)bVar118 * auVar120._12_4_ |
                          (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar122._12_4_);
              auVar122 = vmovlhps_avx(auVar161._0_16_,auVar222._0_16_);
              auVar280._0_4_ = (float)local_7a8._0_4_ * auVar122._0_4_;
              auVar280._4_4_ = (float)local_7a8._0_4_ * auVar122._4_4_;
              auVar280._8_4_ = (float)local_7a8._0_4_ * auVar122._8_4_;
              auVar280._12_4_ = (float)local_7a8._0_4_ * auVar122._12_4_;
              auVar122 = vmovshdup_avx(auVar128);
              fVar130 = local_628._0_4_ + auVar128._0_4_ * (float)local_878._0_4_;
              auVar120 = vmovshdup_avx(local_628);
              fVar229 = auVar120._0_4_ + auVar122._0_4_ * (float)local_878._0_4_;
              fVar131 = (float)local_5d0._36_4_ * (float)local_878._0_4_ + (float)local_778._0_4_;
              auVar254._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar128._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar128._12_4_ ^ 0x80000000;
              local_5d0._36_4_ = -(float)local_5d0._36_4_;
              local_578._20_4_ = fStack_434;
              local_578._16_4_ = local_438;
              local_578._24_4_ = fStack_430;
              local_578._28_4_ = fStack_42c;
              local_588.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )&this_02[0x66666666666].values.ptr;
              local_580.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                   (TaggedPointer<pbrt::HGPhaseFunction>)
                   ((ulong)&this_02[3].values | 0x1000000000000);
              auVar144._4_4_ = fVar130;
              auVar144._0_4_ = fVar130;
              auVar144._8_4_ = fVar130;
              auVar144._12_4_ = fVar130;
              auVar200._4_4_ = fVar229;
              auVar200._0_4_ = fVar229;
              auVar200._8_4_ = fVar229;
              auVar200._12_4_ = fVar229;
              local_5d0._0_16_ = vmovlhps_avx(auVar144,auVar200);
              auVar201._4_4_ = fVar131;
              auVar201._0_4_ = fVar131;
              auVar201._8_4_ = fVar131;
              auVar201._12_4_ = fVar131;
              local_5d0._40_12_ = ZEXT812(0);
              local_5d0._52_4_ = 0;
              local_598 = 0.0;
              local_5d0._16_8_ = vmovlps_avx(auVar201);
              local_5d0._24_4_ = vextractps_avx(local_768,1);
              local_5d0._28_8_ = vmovlps_avx(auVar254);
              local_590 = (MediumInterface *)0x0;
              local_578._0_16_ = vunpcklpd_avx(auVar95,auVar136);
              auVar152._16_16_ = auVar280;
              auVar152._0_16_ = auVar191;
              auVar209._16_16_ = auVar237;
              auVar209._0_16_ = auVar191;
              local_1e8 = ZEXT1632(auVar280);
              auVar151 = vperm2f128_avx(auVar209,local_1e8,0x21);
              local_558 = vshufpd_avx(auVar152,auVar151,8);
              in_ZMM8 = ZEXT1664((undefined1  [16])local_538.values.values);
              in_ZMM13 = ZEXT1664(auVar239);
              local_218 = (float  [4])local_538.values.values;
              Li::anon_class_88_11_08f5f5b0::operator()
                        ((anon_class_88_11_08f5f5b0 *)local_6a0,(MediumSample *)local_5d0);
              this_03 = local_7b8;
              goto LAB_003f8887;
            }
            local_1f8 = fVar229 * -fVar131;
            fStack_1f4 = local_648._4_4_ * -fVar131;
            fStack_1f0 = local_648._8_4_ * -fVar131;
            fStack_1ec = local_648._12_4_ * -fVar131;
            auVar210 = ZEXT3264(local_648);
            this_03 = local_7b8;
          }
          else {
            auVar133._4_4_ = uVar112;
            auVar133._0_4_ = uVar112;
            auVar133._8_4_ = uVar112;
            auVar133._12_4_ = uVar112;
            auVar34._8_4_ = 0x80000000;
            auVar34._0_8_ = 0x8000000080000000;
            auVar34._12_4_ = 0x80000000;
            auVar128 = vxorps_avx512vl(auVar133,auVar34);
            local_1c8 = auVar173._0_4_ * auVar128._0_4_;
            fStack_1c4 = auVar173._4_4_ * auVar128._4_4_;
            fStack_1c0 = auVar173._8_4_ * auVar128._8_4_;
            fStack_1bc = auVar173._12_4_ * auVar128._12_4_;
            this_03 = local_7b8;
          }
          goto LAB_003f8890;
        }
        local_748._0_8_ = vmovlps_avx(auVar122);
        unique0x000f4700 = vmovlhps_avx(auVar120,auVar128);
        local_6a0._0_8_ = &local_7c0;
        local_6a0._8_8_ = &local_708;
        local_6a0._16_8_ = &local_5e8;
        local_6a0._32_8_ = &local_87e;
        unique0x00005300 = &local_7bc;
        local_658 = &local_87d;
        local_650 = &local_790;
        local_87c = (float)local_878._0_4_;
        puVar105 = (undefined8 *)(TVar9.bits & 0xffffffffffff);
        local_748._8_4_ = fVar130;
        local_728.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar9.bits;
        Transform::ApplyInverse
                  (&local_848,(Transform *)(puVar105 + 0xf),(Ray *)local_748,&local_87c);
        auVar171._0_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar171._4_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar171._8_8_ = 0;
        auVar128 = vmovshdup_avx(auVar171);
        fVar130 = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x *
                  local_848.d.super_Tuple3<pbrt::Vector3,_float>.x + auVar171._0_4_ + auVar128._0_4_
        ;
        if (fVar130 < 0.0) {
          fVar130 = sqrtf(fVar130);
        }
        else {
          auVar128 = vsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
          fVar130 = auVar128._0_4_;
        }
        local_87c = fVar130 * local_87c;
        auVar174._0_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar174._4_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar174._8_8_ = 0;
        auVar128 = vmovshdup_avx(auVar174);
        fVar130 = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x *
                  local_848.d.super_Tuple3<pbrt::Vector3,_float>.x + auVar174._0_4_ + auVar128._0_4_
        ;
        if (fVar130 < 0.0) {
          fVar130 = sqrtf(fVar130);
        }
        else {
          auVar128 = vsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
          fVar130 = auVar128._0_4_;
        }
        auVar176._4_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar176._0_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar176._8_8_ = 0;
        auVar230._4_4_ = fVar130;
        auVar230._0_4_ = fVar130;
        auVar230._8_4_ = fVar130;
        auVar230._12_4_ = fVar130;
        auVar128 = vdivps_avx(auVar176,auVar230);
        uVar168 = vmovlps_avx(auVar128);
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar168;
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar168 >> 0x20);
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar130;
        local_808._0_4_ = local_87c;
        auVar128 = ZEXT816(0) << 0x40;
        bVar118 = false;
        uVar112 = 0;
        do {
          pVVar113 = &local_848.d;
          if ((uVar112 != 0) &&
             (pVVar113 = (Vector3f *)((long)&local_848.d.super_Tuple3<pbrt::Vector3,_float> + 4),
             uVar112 != 1)) {
            pVVar113 = (Vector3f *)((long)&local_848.d.super_Tuple3<pbrt::Vector3,_float> + 8);
          }
          fVar130 = 1.0 / (pVVar113->super_Tuple3<pbrt::Vector3,_float>).x;
          pfVar114 = (float *)(puVar105 + 1);
          if ((uVar112 != 0) && (pfVar114 = (float *)((long)puVar105 + 0xc), uVar112 != 1)) {
            pfVar114 = (float *)(puVar105 + 2);
          }
          pRVar115 = &local_848;
          if ((uVar112 != 0) &&
             (pRVar115 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 4),
             uVar112 != 1)) {
            pRVar115 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 8);
          }
          pfVar109 = (float *)((long)puVar105 + 0x14);
          if ((uVar112 != 0) && (pfVar109 = (float *)(puVar105 + 3), uVar112 != 1)) {
            pfVar109 = (float *)((long)puVar105 + 0x1c);
          }
          pRVar116 = &local_848;
          if ((uVar112 != 0) &&
             (pRVar116 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 4),
             uVar112 != 1)) {
            pRVar116 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 8);
          }
          auVar120 = ZEXT416((uint)(fVar130 *
                                   (*pfVar109 - (pRVar116->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar136 = ZEXT416((uint)(fVar130 *
                                   (*pfVar114 - (pRVar115->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar122 = vminss_avx(auVar120,auVar136);
          auVar128 = vmaxss_avx(auVar122,auVar128);
          auVar122 = vmaxss_avx(auVar136,auVar120);
          auVar122 = vminss_avx(ZEXT416((uint)(auVar122._0_4_ * 1.0000004)),
                                ZEXT416((uint)local_808._0_4_));
          auVar228 = ZEXT856(auVar122._8_8_);
          local_808._0_4_ = auVar122._0_4_;
          if (auVar122._0_4_ < auVar128._0_4_) break;
          bVar118 = 1 < uVar112;
          uVar112 = uVar112 + 1;
        } while (uVar112 != 3);
        if (bVar118) {
          uVar168 = 0;
          _local_6d8 = ZEXT416(*(uint *)(puVar105 + 0xe));
          local_878 = auVar128;
          SVar284 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(puVar105 + 4),pSVar104);
          auVar213._0_8_ = SVar284.values.values._8_8_;
          auVar213._8_56_ = auVar228;
          local_508._8_8_ = uVar168;
          local_508._0_8_ = SVar284.values.values._0_8_;
          _local_7f8 = auVar213._0_16_;
          auVar170 = (undefined1  [56])0x0;
          _local_7e8 = ZEXT416(*(uint *)(puVar105 + 0xe));
          SVar284 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(puVar105 + 9),pSVar104);
          auVar214._0_8_ = SVar284.values.values._8_8_;
          auVar214._8_56_ = auVar228;
          auVar155._0_8_ = SVar284.values.values._0_8_;
          auVar155._8_56_ = auVar170;
          auVar128 = vunpcklpd_avx(local_508,_local_7f8);
          local_378 = (float)local_6d8._0_4_ * auVar128._0_4_;
          fStack_374 = (float)local_6d8._0_4_ * auVar128._4_4_;
          fStack_370 = (float)local_6d8._0_4_ * auVar128._8_4_;
          fStack_36c = (float)local_6d8._0_4_ * auVar128._12_4_;
          auVar128 = vmovlhps_avx(auVar155._0_16_,auVar214._0_16_);
          local_388 = (float)local_7e8._0_4_ * auVar128._0_4_;
          fStack_384 = (float)local_7e8._0_4_ * auVar128._4_4_;
          fStack_380 = (float)local_7e8._0_4_ * auVar128._8_4_;
          fStack_37c = (float)local_7e8._0_4_ * auVar128._12_4_;
          local_418 = local_388 + local_378;
          fStack_414 = fStack_384 + fStack_374;
          fStack_410 = fStack_380 + fStack_370;
          fStack_40c = fStack_37c + fStack_36c;
          fVar130 = *(float *)(puVar105 + 2);
          fVar167 = *(float *)((long)puVar105 + 0x1c) - fVar130;
          uVar168 = vcmpss_avx512f(ZEXT416((uint)fVar130),
                                   ZEXT416((uint)*(float *)((long)puVar105 + 0x1c)),1);
          bVar12 = (bool)((byte)uVar168 & 1);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = puVar105[1];
          auVar177._8_8_ = 0;
          auVar177._0_8_ = *(ulong *)((long)puVar105 + 0x14);
          auVar128 = vsubps_avx(auVar177,auVar134);
          auVar258._8_8_ = 0;
          auVar258._0_4_ = local_848.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar258._4_4_ = local_848.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar122 = vsubps_avx(auVar258,auVar134);
          uVar100 = vcmpps_avx512vl(auVar134,auVar177,1);
          auVar120 = vdivps_avx512vl(auVar122,auVar128);
          bVar118 = (bool)((byte)uVar100 & 1);
          auVar121._0_4_ = (float)((uint)bVar118 * auVar120._0_4_ | (uint)!bVar118 * auVar122._0_4_)
          ;
          bVar118 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar118 * auVar120._4_4_ | (uint)!bVar118 * auVar122._4_4_;
          bVar118 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar118 * auVar120._8_4_ | (uint)!bVar118 * auVar122._8_4_;
          bVar118 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar118 * auVar120._12_4_ | (uint)!bVar118 * auVar122._12_4_;
          auVar122 = vmovshdup_avx(auVar121);
          auVar135._4_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar135._0_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar135._8_8_ = 0;
          auVar128 = vdivps_avx(auVar135,auVar128);
          local_7ac = local_848.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar167;
          local_820 = vmovlps_avx(auVar128);
          uVar168 = local_820;
          auVar272 = ZEXT1664(local_878);
          fVar268 = local_878._0_4_;
          local_820._4_4_ = (float)((ulong)local_820 >> 0x20);
          fVar229 = fVar268 * (float)local_820 + auVar121._0_4_;
          fVar131 = fVar268 * local_820._4_4_ + auVar122._0_4_;
          fVar130 = (float)((uint)bVar12 *
                            (int)((local_848.o.super_Tuple3<pbrt::Point3,_float>.z - fVar130) /
                                 fVar167) +
                           (uint)!bVar12 *
                           (int)(local_848.o.super_Tuple3<pbrt::Point3,_float>.z - fVar130)) +
                    fVar268 * local_7ac;
          piVar1 = (int *)(puVar105 + 0x23);
          piVar2 = (int *)((long)puVar105 + 0x11c);
          piVar3 = (int *)(puVar105 + 0x24);
          lVar107 = 0;
          pfVar114 = (float *)((long)&local_820 + 4);
          auVar210 = ZEXT464((uint)local_7a8._0_4_);
          local_820 = uVar168;
          do {
            iVar106 = (int)lVar107;
            fVar167 = fVar229;
            if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
              fVar167 = fVar130;
            }
            piVar110 = piVar1;
            if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
              piVar110 = piVar3;
            }
            piVar111 = piVar1;
            if ((iVar106 != 0) && (piVar111 = piVar2, iVar106 != 1)) {
              piVar111 = piVar3;
            }
            auVar255._0_4_ = (float)(*piVar111 + -1);
            auVar255._4_12_ = in_ZMM8._4_12_;
            auVar128 = vminss_avx(auVar255,ZEXT416((uint)(fVar167 * (float)*piVar110)));
            uVar168 = vcmpss_avx512f(ZEXT416((uint)(fVar167 * (float)*piVar110)),ZEXT816(0) << 0x40,
                                     1);
            iVar108 = (int)(float)((uint)!(bool)((byte)uVar168 & 1) * auVar128._0_4_);
            local_814[lVar107] = iVar108;
            pfVar109 = (float *)&local_820;
            if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
              pfVar109 = &local_7ac;
            }
            if ((*pfVar109 == 0.0) && (!NAN(*pfVar109))) {
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              *pfVar109 = 0.0;
            }
            pfVar109 = (float *)&local_820;
            if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
              pfVar109 = &local_7ac;
            }
            if (0.0 <= *pfVar109) {
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              fVar167 = fVar229;
              if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
                fVar167 = fVar130;
              }
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              local_854[lVar107] =
                   fVar268 + ((float)(iVar108 + 1) / (float)*piVar110 - fVar167) / *pfVar109;
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              afStack_714[lVar107] = 1.0 / ((float)*piVar110 * *pfVar109);
              aiStack_720[lVar107] = 1;
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              iVar106 = *piVar110;
            }
            else {
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              fVar167 = fVar229;
              if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
                fVar167 = fVar130;
              }
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              local_854[lVar107] =
                   fVar268 + ((float)iVar108 / (float)*piVar110 - fVar167) / *pfVar109;
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              afStack_714[lVar107] = -1.0 / ((float)*piVar110 * *pfVar109);
              aiStack_720[lVar107] = -1;
              iVar106 = -1;
            }
            aiStack_604[lVar107] = iVar106;
            lVar107 = lVar107 + 1;
          } while (lVar107 != 3);
          local_6d8._4_4_ = uStack_7d4;
          local_6d8._0_4_ = local_7d8;
          uStack_6d0._4_4_ = (float)uStack_7cc;
          uStack_6d0._0_4_ = (float)uStack_7d0;
          do {
            iVar106 = *(int *)(&DAT_005841e0 +
                              (ulong)((uint)(local_854[1] < local_854[2]) |
                                     (uint)(local_854[0] < local_854[1]) * 4 +
                                     (uint)(local_854[0] < local_854[2]) * 2) * 4);
            auVar96._4_4_ = fStack_414;
            auVar96._0_4_ = local_418;
            auVar96._8_4_ = fStack_410;
            auVar96._12_4_ = fStack_40c;
            uVar4 = *(undefined4 *)
                     (puVar105[0x20] +
                     (((long)local_814[2] * (long)*(int *)((long)puVar105 + 0x11c) +
                      (long)local_814[1]) * (long)*(int *)(puVar105 + 0x23) + (long)local_814[0]) *
                     4);
            auVar13._4_4_ = uVar4;
            auVar13._0_4_ = uVar4;
            auVar13._8_4_ = uVar4;
            auVar13._12_4_ = uVar4;
            local_508 = vmulps_avx512vl(auVar96,auVar13);
            auVar128 = vminss_avx(ZEXT416((uint)local_854[iVar106]),ZEXT416((uint)local_808._0_4_));
            if ((local_508._0_4_ != 0.0) || (NAN(local_508._0_4_))) {
              local_7f8._0_4_ = auVar128._0_4_;
              local_878 = auVar272._0_16_;
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              _local_7e8 = vxorps_avx512vl(local_508,auVar21);
              do {
                fVar130 = logf(1.0 - auVar210._0_4_);
                uVar99 = local_790.state;
                fVar130 = (float)local_878._0_4_ - fVar130 / (float)local_508._0_4_;
                local_790.state = local_790.state * 0x5851f42d4c957f2d + local_790.inc;
                uVar112 = (uint)(uVar99 >> 0x2d) ^ (uint)(uVar99 >> 0x1b);
                bVar101 = (byte)(uVar99 >> 0x3b);
                auVar128 = vcvtusi2ss_avx512f(in_XMM15,uVar112 >> bVar101 |
                                                       uVar112 << 0x20 - bVar101);
                auVar128 = vminss_avx(ZEXT416((uint)(auVar128._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar210 = ZEXT1664(auVar128);
                if ((float)local_7f8._0_4_ <= fVar130) {
                  fVar130 = (float)local_7f8._0_4_ - (float)local_878._0_4_;
                  local_a8._0_4_ = fVar130 * (float)local_7e8._0_4_;
                  local_a8._4_4_ = fVar130 * (float)local_7e8._4_4_;
                  local_a8._8_4_ = fVar130 * (float)uStack_7e0;
                  local_a8._12_4_ = fVar130 * uStack_7e0._4_4_;
                  auVar28._8_4_ = 0x3fb8aa3b;
                  auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar28._12_4_ = 0x3fb8aa3b;
                  auVar122 = vmulps_avx512vl(local_a8,auVar28);
                  auVar128 = vroundps_avx(auVar122,9);
                  auVar122 = vsubps_avx(auVar122,auVar128);
                  auVar182._0_4_ = (int)auVar128._0_4_;
                  auVar182._4_4_ = (int)auVar128._4_4_;
                  auVar182._8_4_ = (int)auVar128._8_4_;
                  auVar182._12_4_ = (int)auVar128._12_4_;
                  auVar232._8_4_ = 0x3da00ac9;
                  auVar232._0_8_ = 0x3da00ac93da00ac9;
                  auVar232._12_4_ = 0x3da00ac9;
                  auVar29._8_4_ = 0x3e679a0b;
                  auVar29._0_8_ = 0x3e679a0b3e679a0b;
                  auVar29._12_4_ = 0x3e679a0b;
                  auVar128 = vfmadd213ps_avx512vl(auVar232,auVar122,auVar29);
                  auVar30._8_4_ = 0x3f321004;
                  auVar30._0_8_ = 0x3f3210043f321004;
                  auVar30._12_4_ = 0x3f321004;
                  auVar128 = vfmadd213ps_avx512vl(auVar128,auVar122,auVar30);
                  auVar86._4_4_ = uStack_7d4;
                  auVar86._0_4_ = local_7d8;
                  auVar86._8_4_ = uStack_7d0;
                  auVar86._12_4_ = uStack_7cc;
                  auVar122 = vfmadd213ps_fma(auVar128,auVar122,auVar86);
                  auVar120 = vpsrld_avx(auVar122,0x17);
                  auVar245._8_4_ = 0xffffff81;
                  auVar245._0_8_ = 0xffffff81ffffff81;
                  auVar245._12_4_ = 0xffffff81;
                  auVar128 = vpaddd_avx(auVar182,auVar245);
                  auVar128 = vpaddd_avx(auVar128,auVar120);
                  uVar100 = vpcmpgtd_avx512vl(auVar128,auVar245);
                  uVar100 = uVar100 & 0xf;
                  auVar31._8_4_ = 0x7f;
                  auVar31._0_8_ = 0x7f0000007f;
                  auVar31._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar128,auVar31);
                  uVar103 = uVar103 & 0xf;
                  auVar32._8_4_ = 0x807fffff;
                  auVar32._0_8_ = 0x807fffff807fffff;
                  auVar32._12_4_ = 0x807fffff;
                  auVar122 = vpandd_avx512vl(auVar122,auVar32);
                  auVar128 = vpslld_avx(auVar128,0x17);
                  auVar33._8_4_ = 0x3f800000;
                  auVar33._0_8_ = 0x3f8000003f800000;
                  auVar33._12_4_ = 0x3f800000;
                  auVar128 = vpaddd_avx512vl(auVar128,auVar33);
                  auVar128 = vpord_avx512vl(auVar128,auVar122);
                  auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar118 = (bool)((byte)uVar103 & 1);
                  local_b8 = (float)((uint)bVar118 * auVar122._0_4_ |
                                    (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar128._0_4_);
                  bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
                  fStack_b4 = (float)((uint)bVar118 * auVar122._4_4_ |
                                     (uint)!bVar118 *
                                     (uint)((byte)(uVar100 >> 1) & 1) * auVar128._4_4_);
                  bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
                  fStack_b0 = (float)((uint)bVar118 * auVar122._8_4_ |
                                     (uint)!bVar118 *
                                     (uint)((byte)(uVar100 >> 2) & 1) * auVar128._8_4_);
                  bVar118 = SUB81(uVar103 >> 3,0);
                  fStack_ac = (float)((uint)bVar118 * auVar122._12_4_ |
                                     (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar128._12_4_);
                  local_6d8._4_4_ = fStack_b4 * (float)local_6d8._4_4_;
                  local_6d8._0_4_ = local_b8 * (float)local_6d8._0_4_;
                  uStack_6d0._0_4_ = fStack_b0 * (float)uStack_6d0;
                  uStack_6d0._4_4_ = fStack_ac * uStack_6d0._4_4_;
                  cVar102 = '\n';
                  bVar118 = false;
                  local_c8 = _local_7e8;
                }
                else if ((float)local_808._0_4_ <= fVar130) {
                  cVar102 = '\0';
                  bVar118 = true;
                  local_878 = ZEXT416((uint)fVar130);
                }
                else {
                  local_7a8._0_4_ = auVar128._0_4_;
                  fVar229 = fVar130 - (float)local_878._0_4_;
                  local_108._0_4_ = fVar229 * (float)local_7e8._0_4_;
                  local_108._4_4_ = fVar229 * (float)local_7e8._4_4_;
                  local_108._8_4_ = fVar229 * (float)uStack_7e0;
                  local_108._12_4_ = fVar229 * uStack_7e0._4_4_;
                  auVar22._8_4_ = 0x3fb8aa3b;
                  auVar22._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar22._12_4_ = 0x3fb8aa3b;
                  auVar128 = vmulps_avx512vl(local_108,auVar22);
                  _local_6f8 = vroundps_avx(auVar128,9);
                  auVar128 = vsubps_avx(auVar128,_local_6f8);
                  auVar179._8_4_ = 0x3da00ac9;
                  auVar179._0_8_ = 0x3da00ac93da00ac9;
                  auVar179._12_4_ = 0x3da00ac9;
                  auVar23._8_4_ = 0x3e679a0b;
                  auVar23._0_8_ = 0x3e679a0b3e679a0b;
                  auVar23._12_4_ = 0x3e679a0b;
                  auVar122 = vfmadd213ps_avx512vl(auVar179,auVar128,auVar23);
                  auVar24._8_4_ = 0x3f321004;
                  auVar24._0_8_ = 0x3f3210043f321004;
                  auVar24._12_4_ = 0x3f321004;
                  auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar24);
                  auVar85._4_4_ = uStack_7d4;
                  auVar85._0_4_ = local_7d8;
                  auVar85._8_4_ = uStack_7d0;
                  auVar85._12_4_ = uStack_7cc;
                  local_6e8 = vfmadd213ps_fma(auVar122,auVar128,auVar85);
                  auVar180._0_4_ =
                       fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.x +
                       local_848.o.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar180._4_4_ =
                       fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.y +
                       local_848.o.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar180._8_4_ = fVar130 * 0.0 + 0.0;
                  auVar180._12_4_ = fVar130 * 0.0 + 0.0;
                  uVar227 = auVar180._8_8_;
                  local_860.super_Tuple3<pbrt::Point3,_float>.z =
                       fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.z +
                       local_848.o.super_Tuple3<pbrt::Point3,_float>.z;
                  uVar169 = 0;
                  uVar168 = vmovlps_avx(auVar180);
                  local_860.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar168;
                  local_860.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar168 >> 0x20);
                  local_628 = ZEXT416((uint)fVar130);
                  SVar284 = UniformGridMediumProvider::Density
                                      ((UniformGridMediumProvider *)*puVar105,&local_860,pSVar104);
                  local_768._8_8_ = uVar169;
                  local_768._0_8_ = SVar284.values.values._0_8_;
                  local_778._8_8_ = uVar227;
                  local_778._0_8_ = SVar284.values.values._8_8_;
                  p.super_Tuple3<pbrt::Point3,_float>.y =
                       local_860.super_Tuple3<pbrt::Point3,_float>.y;
                  p.super_Tuple3<pbrt::Point3,_float>.x =
                       local_860.super_Tuple3<pbrt::Point3,_float>.x;
                  p.super_Tuple3<pbrt::Point3,_float>.z =
                       local_860.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar170 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  auVar228 = ZEXT856(0);
                  SVar284 = UniformGridMediumProvider::Le
                                      ((UniformGridMediumProvider *)*puVar105,p,pSVar104);
                  auVar215._0_8_ = SVar284.values.values._8_8_;
                  auVar215._8_56_ = auVar170;
                  auVar156._0_8_ = SVar284.values.values._0_8_;
                  auVar156._8_56_ = auVar228;
                  _local_4a8 = auVar215._0_16_;
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0x7c))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0xf)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x10)));
                  fVar130 = auVar128._0_4_ + *(float *)((long)puVar105 + 0x84);
                  local_4b8 = ZEXT416((uint)fVar130);
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0x8c))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0x11)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x12)));
                  local_4c8[0] = auVar128._0_4_ + *(float *)((long)puVar105 + 0x94);
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0x9c))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0x13)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x14)));
                  auVar122 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0xac))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0x15)));
                  auVar122 = vfmadd231ss_fma(auVar122,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x16)));
                  fVar229 = auVar122._0_4_ + *(float *)((long)puVar105 + 0xb4);
                  bVar118 = fVar229 == 1.0;
                  fVar131 = auVar128._0_4_ + *(float *)((long)puVar105 + 0xa4);
                  auVar181._0_4_ = local_748._16_4_ * local_748._16_4_;
                  auVar181._4_4_ = local_748._20_4_ * local_748._20_4_;
                  auVar181._8_8_ = 0;
                  auVar128 = vmovshdup_avx(auVar181);
                  fVar167 = (float)local_748._12_4_ * (float)local_748._12_4_ + auVar181._0_4_ +
                            auVar128._0_4_;
                  if (fVar167 < 0.0) {
                    local_3e8._0_16_ = auVar156._0_16_;
                    local_4b8 = ZEXT416((uint)fVar130);
                    local_4c8 = (float  [4])ZEXT416((uint)local_4c8[0]);
                    local_528 = ZEXT416((uint)fVar131);
                    local_5f8._0_4_ = fVar229;
                    fVar130 = sqrtf(fVar167);
                    fVar229 = (float)local_5f8._0_4_;
                    auVar128 = _local_4a8;
                    fVar131 = (float)local_528._0_4_;
                  }
                  else {
                    auVar128 = vsqrtss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                    fVar130 = auVar128._0_4_;
                    local_3e8._0_16_ = auVar156._0_16_;
                    auVar128 = _local_4a8;
                  }
                  auVar183._0_4_ = (int)(float)local_6f8._0_4_;
                  auVar183._4_4_ = (int)(float)local_6f8._4_4_;
                  auVar183._8_4_ = (int)fStack_6f0;
                  auVar183._12_4_ = (int)fStack_6ec;
                  auVar120 = vpsrld_avx(local_6e8,0x17);
                  auVar246._8_4_ = 0xffffff81;
                  auVar246._0_8_ = 0xffffff81ffffff81;
                  auVar246._12_4_ = 0xffffff81;
                  auVar122 = vpaddd_avx(auVar183,auVar246);
                  auVar122 = vpaddd_avx(auVar122,auVar120);
                  uVar100 = vpcmpgtd_avx512vl(auVar122,auVar246);
                  uVar100 = uVar100 & 0xf;
                  auVar25._8_4_ = 0x7f;
                  auVar25._0_8_ = 0x7f0000007f;
                  auVar25._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar122,auVar25);
                  uVar103 = uVar103 & 0xf;
                  auVar26._8_4_ = 0x807fffff;
                  auVar26._0_8_ = 0x807fffff807fffff;
                  auVar26._12_4_ = 0x807fffff;
                  auVar120 = vpandd_avx512vl(local_6e8,auVar26);
                  auVar122 = vpslld_avx(auVar122,0x17);
                  auVar27._8_4_ = 0x3f800000;
                  auVar27._0_8_ = 0x3f8000003f800000;
                  auVar27._12_4_ = 0x3f800000;
                  auVar122 = vpaddd_avx512vl(auVar122,auVar27);
                  auVar122 = vpord_avx512vl(auVar122,auVar120);
                  auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar12 = (bool)((byte)uVar103 & 1);
                  local_4a8._0_4_ =
                       (uint)bVar12 * auVar120._0_4_ |
                       (uint)!bVar12 * (uint)((byte)uVar100 & 1) * auVar122._0_4_;
                  bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
                  local_4a8._4_4_ =
                       (uint)bVar12 * auVar120._4_4_ |
                       (uint)!bVar12 * (uint)((byte)(uVar100 >> 1) & 1) * auVar122._4_4_;
                  bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
                  fStack_4a0 = (float)((uint)bVar12 * auVar120._8_4_ |
                                      (uint)!bVar12 *
                                      (uint)((byte)(uVar100 >> 2) & 1) * auVar122._8_4_);
                  bVar12 = SUB81(uVar103 >> 3,0);
                  fStack_49c = (float)((uint)bVar12 * auVar120._12_4_ |
                                      (uint)!bVar12 * (uint)(byte)(uVar100 >> 3) * auVar122._12_4_);
                  auVar120 = vmovlhps_avx(local_768,local_778);
                  auVar281._0_4_ = auVar120._0_4_ * local_378;
                  auVar281._4_4_ = auVar120._4_4_ * fStack_374;
                  auVar281._8_4_ = auVar120._8_4_ * fStack_370;
                  auVar281._12_4_ = auVar120._12_4_ * fStack_36c;
                  auVar136 = vshufpd_avx(auVar281,auVar281,1);
                  auVar233._0_4_ = auVar120._0_4_ * local_388;
                  auVar233._4_4_ = auVar120._4_4_ * fStack_384;
                  auVar233._8_4_ = auVar120._8_4_ * fStack_380;
                  auVar233._12_4_ = auVar120._12_4_ * fStack_37c;
                  auVar237 = vshufpd_avx(auVar233,auVar233,1);
                  local_538.values.values[0] = (float)local_4a8._0_4_ * (float)local_6d8._0_4_;
                  local_538.values.values[1] = (float)local_4a8._4_4_ * (float)local_6d8._4_4_;
                  local_538.values.values[2] = fStack_4a0 * (float)uStack_6d0;
                  local_538.values.values[3] = fStack_49c * uStack_6d0._4_4_;
                  auVar123._0_4_ =
                       (uint)bVar118 * (int)local_4b8._0_4_ +
                       (uint)!bVar118 * (int)(local_4b8._0_4_ / fVar229);
                  auVar123._4_12_ = local_4b8._4_12_;
                  iVar108 = (uint)bVar118 * (int)local_4c8[0] +
                            (uint)!bVar118 * (int)(local_4c8[0] / fVar229);
                  iVar119 = (uint)bVar118 * (int)fVar131 + (uint)!bVar118 * (int)(fVar131 / fVar229)
                  ;
                  auVar269._0_8_ = local_748._12_8_ ^ 0x8000000080000000;
                  auVar269._8_4_ = 0x80000000;
                  auVar269._12_4_ = 0x80000000;
                  auVar273._4_4_ = fVar130;
                  auVar273._0_4_ = fVar130;
                  auVar273._8_4_ = fVar130;
                  auVar273._12_4_ = fVar130;
                  auVar122 = vdivps_avx(auVar269,auVar273);
                  auVar274._0_4_ = -fStack_734;
                  auVar274._4_4_ = 0x80000000;
                  auVar274._8_4_ = 0x80000000;
                  auVar274._12_4_ = 0x80000000;
                  auVar137._0_4_ = auVar274._0_4_ / fVar130;
                  auVar137._4_12_ = auVar274._4_12_;
                  auVar259._4_4_ = iVar108;
                  auVar259._0_4_ = iVar108;
                  auVar259._8_4_ = iVar108;
                  auVar259._12_4_ = iVar108;
                  auVar264._4_4_ = iVar119;
                  auVar264._0_4_ = iVar119;
                  auVar264._8_4_ = iVar119;
                  auVar264._12_4_ = iVar119;
                  local_5d0._40_16_ = ZEXT816(0) << 0x20;
                  local_598 = 0.0;
                  local_5d0._0_16_ = vshufps_avx(auVar123,auVar259,0x40);
                  local_5d0._16_8_ = vmovlps_avx(auVar264);
                  local_5d0._24_4_ = FStack_730;
                  local_5d0._28_8_ = vmovlps_avx(auVar122);
                  local_590 = (MediumInterface *)0x0;
                  auVar149._16_16_ = auVar237;
                  auVar149._0_16_ = auVar137;
                  auVar203._16_16_ = auVar136;
                  auVar203._0_16_ = auVar137;
                  auVar151 = vperm2f128_avx(auVar203,auVar149,0x31);
                  auVar204._16_16_ = auVar233;
                  auVar204._0_16_ = auVar281;
                  local_578 = vunpcklpd_avx(auVar204,auVar151);
                  local_558._16_16_ = vmovlhps_avx(local_3e8._0_16_,auVar128);
                  local_558._0_16_ = local_508;
                  in_ZMM8 = ZEXT464((uint)FStack_730);
                  in_ZMM13 = ZEXT1664(auVar128);
                  local_5d0._36_4_ = auVar137._0_4_;
                  local_588.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                           )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                             )TVar9.bits;
                  local_580.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((long)puVar105 + 0x74U | 0x1000000000000);
                  local_4c8 = (float  [4])local_538.values.values;
                  local_4b8 = auVar120;
                  local_3e8 = ZEXT1632(auVar281);
                  bVar118 = Li::anon_class_88_11_08f5f5b0::operator()
                                      ((anon_class_88_11_08f5f5b0 *)local_6a0,
                                       (MediumSample *)local_5d0);
                  local_878._0_4_ =
                       (uint)bVar118 * local_628._0_4_ + (uint)!bVar118 * local_878._0_4_;
                  cVar102 = !bVar118;
                  local_128 = local_7e8;
                  uStack_120 = uStack_7e0;
                  local_6d8._4_4_ = uStack_7d4;
                  local_6d8._0_4_ = local_7d8;
                  uStack_6d0._4_4_ = (float)uStack_7cc;
                  uStack_6d0._0_4_ = (float)uStack_7d0;
                  auVar210 = ZEXT464((uint)local_7a8._0_4_);
                  pSVar104 = local_780;
                }
              } while (cVar102 == '\0');
              if (cVar102 == '\n') {
                auVar272 = ZEXT1664(local_878);
                auVar128 = ZEXT416((uint)local_7f8._0_4_);
                goto LAB_003f69fc;
              }
              auVar272 = ZEXT1664(local_878);
            }
            else {
              auVar14._8_4_ = 0x80000000;
              auVar14._0_8_ = 0x8000000080000000;
              auVar14._12_4_ = 0x80000000;
              local_198 = vxorps_avx512vl(local_508,auVar14);
              fVar130 = auVar128._0_4_ - auVar272._0_4_;
              local_1a8._0_4_ = fVar130 * local_198._0_4_;
              local_1a8._4_4_ = fVar130 * local_198._4_4_;
              local_1a8._8_4_ = fVar130 * local_198._8_4_;
              local_1a8._12_4_ = fVar130 * local_198._12_4_;
              auVar15._8_4_ = 0x3fb8aa3b;
              auVar15._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar15._12_4_ = 0x3fb8aa3b;
              auVar120 = vmulps_avx512vl(local_1a8,auVar15);
              auVar122 = vroundps_avx(auVar120,9);
              auVar120 = vsubps_avx(auVar120,auVar122);
              auVar178._0_4_ = (int)auVar122._0_4_;
              auVar178._4_4_ = (int)auVar122._4_4_;
              auVar178._8_4_ = (int)auVar122._8_4_;
              auVar178._12_4_ = (int)auVar122._12_4_;
              auVar231._8_4_ = 0x3da00ac9;
              auVar231._0_8_ = 0x3da00ac93da00ac9;
              auVar231._12_4_ = 0x3da00ac9;
              auVar16._8_4_ = 0x3e679a0b;
              auVar16._0_8_ = 0x3e679a0b3e679a0b;
              auVar16._12_4_ = 0x3e679a0b;
              auVar122 = vfmadd213ps_avx512vl(auVar231,auVar120,auVar16);
              auVar17._8_4_ = 0x3f321004;
              auVar17._0_8_ = 0x3f3210043f321004;
              auVar17._12_4_ = 0x3f321004;
              auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar17);
              auVar84._4_4_ = uStack_7d4;
              auVar84._0_4_ = local_7d8;
              auVar84._8_4_ = uStack_7d0;
              auVar84._12_4_ = uStack_7cc;
              auVar120 = vfmadd213ps_fma(auVar122,auVar120,auVar84);
              auVar136 = vpsrld_avx(auVar120,0x17);
              auVar244._8_4_ = 0xffffff81;
              auVar244._0_8_ = 0xffffff81ffffff81;
              auVar244._12_4_ = 0xffffff81;
              auVar122 = vpaddd_avx(auVar178,auVar244);
              auVar122 = vpaddd_avx(auVar122,auVar136);
              uVar100 = vpcmpgtd_avx512vl(auVar122,auVar244);
              uVar100 = uVar100 & 0xf;
              auVar18._8_4_ = 0x7f;
              auVar18._0_8_ = 0x7f0000007f;
              auVar18._12_4_ = 0x7f;
              uVar103 = vpcmpgtd_avx512vl(auVar122,auVar18);
              uVar103 = uVar103 & 0xf;
              auVar19._8_4_ = 0x807fffff;
              auVar19._0_8_ = 0x807fffff807fffff;
              auVar19._12_4_ = 0x807fffff;
              auVar120 = vpandd_avx512vl(auVar120,auVar19);
              auVar122 = vpslld_avx(auVar122,0x17);
              auVar20._8_4_ = 0x3f800000;
              auVar20._0_8_ = 0x3f8000003f800000;
              auVar20._12_4_ = 0x3f800000;
              auVar122 = vpaddd_avx512vl(auVar122,auVar20);
              auVar122 = vpord_avx512vl(auVar122,auVar120);
              auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar118 = (bool)((byte)uVar103 & 1);
              local_1b8 = (float)((uint)bVar118 * auVar120._0_4_ |
                                 (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar122._0_4_);
              bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
              fStack_1b4 = (float)((uint)bVar118 * auVar120._4_4_ |
                                  (uint)!bVar118 * (uint)((byte)(uVar100 >> 1) & 1) * auVar122._4_4_
                                  );
              bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
              fStack_1b0 = (float)((uint)bVar118 * auVar120._8_4_ |
                                  (uint)!bVar118 * (uint)((byte)(uVar100 >> 2) & 1) * auVar122._8_4_
                                  );
              bVar118 = SUB81(uVar103 >> 3,0);
              fStack_1ac = (float)((uint)bVar118 * auVar120._12_4_ |
                                  (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar122._12_4_);
              local_6d8._4_4_ = fStack_1b4 * (float)local_6d8._4_4_;
              local_6d8._0_4_ = local_1b8 * (float)local_6d8._0_4_;
              uStack_6d0._0_4_ = fStack_1b0 * (float)uStack_6d0;
              uStack_6d0._4_4_ = fStack_1ac * uStack_6d0._4_4_;
LAB_003f69fc:
              if (((float)local_808._0_4_ < local_854[iVar106]) ||
                 (iVar108 = local_814[iVar106], local_814[iVar106] = iVar108 + aiStack_720[iVar106],
                 iVar108 + aiStack_720[iVar106] == aiStack_604[iVar106])) {
                bVar118 = false;
              }
              else {
                local_854[iVar106] = local_854[iVar106] + afStack_714[iVar106];
                bVar118 = true;
                auVar272 = ZEXT1664(auVar128);
              }
            }
            ray = local_618;
            this = local_750;
            sampler = (SamplerHandle *)local_610;
          } while (bVar118 != false);
        }
        else {
          local_6d8._4_4_ = uStack_7d4;
          local_6d8._0_4_ = local_7d8;
          uStack_6d0._4_4_ = (float)uStack_7cc;
          uStack_6d0._0_4_ = (float)uStack_7d0;
        }
      }
      else if (sVar83 == 3) {
        local_748._0_8_ = vmovlps_avx(auVar122);
        unique0x000f4700 = vmovlhps_avx(auVar120,auVar128);
        local_6a0._0_8_ = &local_7c0;
        local_6a0._8_8_ = &local_708;
        local_6a0._16_8_ = &local_5e8;
        local_6a0._32_8_ = &local_87e;
        unique0x00005300 = &local_7bc;
        local_658 = &local_87d;
        local_650 = &local_790;
        local_820 = CONCAT44(local_820._4_4_,local_878._0_4_);
        puVar105 = (undefined8 *)(TVar9.bits & 0xffffffffffff);
        local_748._8_4_ = fVar130;
        local_728.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar9.bits;
        Transform::ApplyInverse
                  (&local_848,(Transform *)(puVar105 + 0xf),(Ray *)local_748,(Float *)&local_820);
        auVar172._0_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar172._4_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar172._8_8_ = 0;
        auVar128 = vmovshdup_avx(auVar172);
        fVar130 = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x *
                  local_848.d.super_Tuple3<pbrt::Vector3,_float>.x + auVar172._0_4_ + auVar128._0_4_
        ;
        if (fVar130 < 0.0) {
          fVar130 = sqrtf(fVar130);
        }
        else {
          auVar128 = vsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
          fVar130 = auVar128._0_4_;
        }
        local_820 = CONCAT44(local_820._4_4_,fVar130 * (float)local_820);
        auVar175._0_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar175._4_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar175._8_8_ = 0;
        auVar128 = vmovshdup_avx(auVar175);
        fVar130 = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x *
                  local_848.d.super_Tuple3<pbrt::Vector3,_float>.x + auVar175._0_4_ + auVar128._0_4_
        ;
        if (fVar130 < 0.0) {
          fVar130 = sqrtf(fVar130);
        }
        else {
          auVar128 = vsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
          fVar130 = auVar128._0_4_;
        }
        auVar184._4_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar184._0_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar184._8_8_ = 0;
        auVar234._4_4_ = fVar130;
        auVar234._0_4_ = fVar130;
        auVar234._8_4_ = fVar130;
        auVar234._12_4_ = fVar130;
        auVar128 = vdivps_avx(auVar184,auVar234);
        uVar168 = vmovlps_avx(auVar128);
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar168;
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar168 >> 0x20);
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar130;
        local_808._0_4_ = (float)local_820;
        auVar128 = ZEXT816(0) << 0x40;
        bVar118 = false;
        uVar112 = 0;
        do {
          pVVar113 = &local_848.d;
          if ((uVar112 != 0) &&
             (pVVar113 = (Vector3f *)((long)&local_848.d.super_Tuple3<pbrt::Vector3,_float> + 4),
             uVar112 != 1)) {
            pVVar113 = (Vector3f *)((long)&local_848.d.super_Tuple3<pbrt::Vector3,_float> + 8);
          }
          fVar130 = 1.0 / (pVVar113->super_Tuple3<pbrt::Vector3,_float>).x;
          pfVar114 = (float *)(puVar105 + 1);
          if ((uVar112 != 0) && (pfVar114 = (float *)((long)puVar105 + 0xc), uVar112 != 1)) {
            pfVar114 = (float *)(puVar105 + 2);
          }
          pRVar115 = &local_848;
          if ((uVar112 != 0) &&
             (pRVar115 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 4),
             uVar112 != 1)) {
            pRVar115 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 8);
          }
          pfVar109 = (float *)((long)puVar105 + 0x14);
          if ((uVar112 != 0) && (pfVar109 = (float *)(puVar105 + 3), uVar112 != 1)) {
            pfVar109 = (float *)((long)puVar105 + 0x1c);
          }
          pRVar116 = &local_848;
          if ((uVar112 != 0) &&
             (pRVar116 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 4),
             uVar112 != 1)) {
            pRVar116 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 8);
          }
          auVar120 = ZEXT416((uint)(fVar130 *
                                   (*pfVar109 - (pRVar116->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar136 = ZEXT416((uint)(fVar130 *
                                   (*pfVar114 - (pRVar115->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar122 = vminss_avx(auVar120,auVar136);
          auVar128 = vmaxss_avx(auVar122,auVar128);
          auVar122 = vmaxss_avx(auVar136,auVar120);
          auVar122 = vminss_avx(ZEXT416((uint)(auVar122._0_4_ * 1.0000004)),
                                ZEXT416((uint)local_808._0_4_));
          auVar228 = ZEXT856(auVar122._8_8_);
          local_808._0_4_ = auVar122._0_4_;
          if (auVar122._0_4_ < auVar128._0_4_) break;
          bVar118 = 1 < uVar112;
          uVar112 = uVar112 + 1;
        } while (uVar112 != 3);
        if (bVar118) {
          uVar168 = 0;
          _local_6b8 = ZEXT416(*(uint *)(puVar105 + 0xe));
          local_878 = auVar128;
          SVar284 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(puVar105 + 4),pSVar104);
          auVar216._0_8_ = SVar284.values.values._8_8_;
          auVar216._8_56_ = auVar228;
          local_4e8._8_8_ = uVar168;
          local_4e8._0_8_ = SVar284.values.values._0_8_;
          _local_7f8 = auVar216._0_16_;
          auVar170 = (undefined1  [56])0x0;
          _local_7e8 = ZEXT416(*(uint *)(puVar105 + 0xe));
          SVar284 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(puVar105 + 9),pSVar104);
          auVar217._0_8_ = SVar284.values.values._8_8_;
          auVar217._8_56_ = auVar228;
          auVar157._0_8_ = SVar284.values.values._0_8_;
          auVar157._8_56_ = auVar170;
          auVar128 = vunpcklpd_avx(local_4e8,_local_7f8);
          local_338 = (float)local_6b8._0_4_ * auVar128._0_4_;
          fStack_334 = (float)local_6b8._0_4_ * auVar128._4_4_;
          fStack_330 = (float)local_6b8._0_4_ * auVar128._8_4_;
          fStack_32c = (float)local_6b8._0_4_ * auVar128._12_4_;
          auVar128 = vmovlhps_avx(auVar157._0_16_,auVar217._0_16_);
          local_348 = (float)local_7e8._0_4_ * auVar128._0_4_;
          fStack_344 = (float)local_7e8._0_4_ * auVar128._4_4_;
          fStack_340 = (float)local_7e8._0_4_ * auVar128._8_4_;
          fStack_33c = (float)local_7e8._0_4_ * auVar128._12_4_;
          local_3f8 = local_348 + local_338;
          fStack_3f4 = fStack_344 + fStack_334;
          fStack_3f0 = fStack_340 + fStack_330;
          fStack_3ec = fStack_33c + fStack_32c;
          fVar130 = *(float *)(puVar105 + 2);
          fVar167 = *(float *)((long)puVar105 + 0x1c) - fVar130;
          uVar168 = vcmpss_avx512f(ZEXT416((uint)fVar130),
                                   ZEXT416((uint)*(float *)((long)puVar105 + 0x1c)),1);
          bVar12 = (bool)((byte)uVar168 & 1);
          auVar138._8_8_ = 0;
          auVar138._0_8_ = puVar105[1];
          auVar185._8_8_ = 0;
          auVar185._0_8_ = *(ulong *)((long)puVar105 + 0x14);
          auVar128 = vsubps_avx(auVar185,auVar138);
          auVar260._8_8_ = 0;
          auVar260._0_4_ = local_848.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar260._4_4_ = local_848.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar122 = vsubps_avx(auVar260,auVar138);
          uVar100 = vcmpps_avx512vl(auVar138,auVar185,1);
          auVar120 = vdivps_avx512vl(auVar122,auVar128);
          bVar118 = (bool)((byte)uVar100 & 1);
          auVar124._0_4_ = (float)((uint)bVar118 * auVar120._0_4_ | (uint)!bVar118 * auVar122._0_4_)
          ;
          bVar118 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar118 * auVar120._4_4_ | (uint)!bVar118 * auVar122._4_4_;
          bVar118 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar118 * auVar120._8_4_ | (uint)!bVar118 * auVar122._8_4_;
          bVar118 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar118 * auVar120._12_4_ | (uint)!bVar118 * auVar122._12_4_;
          auVar122 = vmovshdup_avx(auVar124);
          auVar139._4_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar139._0_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar139._8_8_ = 0;
          auVar128 = vdivps_avx(auVar139,auVar128);
          local_87c = local_848.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar167;
          uVar168 = vmovlps_avx(auVar128);
          local_860.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar168;
          local_860.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar168 >> 0x20);
          auVar272 = ZEXT1664(local_878);
          fVar268 = local_878._0_4_;
          fVar229 = fVar268 * local_860.super_Tuple3<pbrt::Point3,_float>.x + auVar124._0_4_;
          fVar131 = fVar268 * local_860.super_Tuple3<pbrt::Point3,_float>.y + auVar122._0_4_;
          fVar130 = (float)((uint)bVar12 *
                            (int)((local_848.o.super_Tuple3<pbrt::Point3,_float>.z - fVar130) /
                                 fVar167) +
                           (uint)!bVar12 *
                           (int)(local_848.o.super_Tuple3<pbrt::Point3,_float>.z - fVar130)) +
                    fVar268 * local_87c;
          piVar1 = (int *)(puVar105 + 0x23);
          piVar2 = (int *)((long)puVar105 + 0x11c);
          piVar3 = (int *)(puVar105 + 0x24);
          lVar107 = 0;
          pfVar114 = &local_860.super_Tuple3<pbrt::Point3,_float>.y;
          auVar210 = ZEXT464((uint)local_7a8._0_4_);
          do {
            iVar106 = (int)lVar107;
            fVar167 = fVar229;
            if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
              fVar167 = fVar130;
            }
            piVar110 = piVar1;
            if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
              piVar110 = piVar3;
            }
            piVar111 = piVar1;
            if ((iVar106 != 0) && (piVar111 = piVar2, iVar106 != 1)) {
              piVar111 = piVar3;
            }
            auVar256._0_4_ = (float)(*piVar111 + -1);
            auVar256._4_12_ = in_ZMM8._4_12_;
            auVar128 = vminss_avx(auVar256,ZEXT416((uint)(fVar167 * (float)*piVar110)));
            uVar168 = vcmpss_avx512f(ZEXT416((uint)(fVar167 * (float)*piVar110)),ZEXT816(0) << 0x40,
                                     1);
            iVar108 = (int)(float)((uint)!(bool)((byte)uVar168 & 1) * auVar128._0_4_);
            local_814[lVar107] = iVar108;
            pfVar109 = (float *)&local_860;
            if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
              pfVar109 = &local_87c;
            }
            if ((*pfVar109 == 0.0) && (!NAN(*pfVar109))) {
              pfVar109 = (float *)&local_860;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_87c;
              }
              *pfVar109 = 0.0;
            }
            pfVar109 = (float *)&local_860;
            if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
              pfVar109 = &local_87c;
            }
            if (0.0 <= *pfVar109) {
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              fVar167 = fVar229;
              if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
                fVar167 = fVar130;
              }
              pfVar109 = (float *)&local_860;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_87c;
              }
              local_854[lVar107] =
                   fVar268 + ((float)(iVar108 + 1) / (float)*piVar110 - fVar167) / *pfVar109;
              pfVar109 = (float *)&local_860;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_87c;
              }
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              afStack_714[lVar107] = 1.0 / ((float)*piVar110 * *pfVar109);
              aiStack_720[lVar107] = 1;
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              iVar106 = *piVar110;
            }
            else {
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              fVar167 = fVar229;
              if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
                fVar167 = fVar130;
              }
              pfVar109 = (float *)&local_860;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_87c;
              }
              local_854[lVar107] =
                   fVar268 + ((float)iVar108 / (float)*piVar110 - fVar167) / *pfVar109;
              pfVar109 = (float *)&local_860;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_87c;
              }
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              afStack_714[lVar107] = -1.0 / ((float)*piVar110 * *pfVar109);
              aiStack_720[lVar107] = -1;
              iVar106 = -1;
            }
            aiStack_604[lVar107] = iVar106;
            lVar107 = lVar107 + 1;
          } while (lVar107 != 3);
          local_6b8._4_4_ = uStack_7d4;
          local_6b8._0_4_ = local_7d8;
          uStack_6b0._4_4_ = (float)uStack_7cc;
          uStack_6b0._0_4_ = (float)uStack_7d0;
          do {
            iVar106 = *(int *)(&DAT_005841e0 +
                              (ulong)((uint)(local_854[1] < local_854[2]) |
                                     (uint)(local_854[0] < local_854[1]) * 4 +
                                     (uint)(local_854[0] < local_854[2]) * 2) * 4);
            auVar98._4_4_ = fStack_3f4;
            auVar98._0_4_ = local_3f8;
            auVar98._8_4_ = fStack_3f0;
            auVar98._12_4_ = fStack_3ec;
            uVar4 = *(undefined4 *)
                     (puVar105[0x20] +
                     (((long)local_814[2] * (long)*(int *)((long)puVar105 + 0x11c) +
                      (long)local_814[1]) * (long)*(int *)(puVar105 + 0x23) + (long)local_814[0]) *
                     4);
            auVar41._4_4_ = uVar4;
            auVar41._0_4_ = uVar4;
            auVar41._8_4_ = uVar4;
            auVar41._12_4_ = uVar4;
            local_4e8 = vmulps_avx512vl(auVar98,auVar41);
            auVar128 = vminss_avx(ZEXT416((uint)local_854[iVar106]),ZEXT416((uint)local_808._0_4_));
            if ((local_4e8._0_4_ != 0.0) || (NAN(local_4e8._0_4_))) {
              local_7f8._0_4_ = auVar128._0_4_;
              local_878 = auVar272._0_16_;
              auVar49._8_4_ = 0x80000000;
              auVar49._0_8_ = 0x8000000080000000;
              auVar49._12_4_ = 0x80000000;
              _local_7e8 = vxorps_avx512vl(local_4e8,auVar49);
              do {
                fVar130 = logf(1.0 - auVar210._0_4_);
                uVar99 = local_790.state;
                fVar130 = (float)local_878._0_4_ - fVar130 / (float)local_4e8._0_4_;
                local_790.state = local_790.state * 0x5851f42d4c957f2d + local_790.inc;
                uVar112 = (uint)(uVar99 >> 0x2d) ^ (uint)(uVar99 >> 0x1b);
                bVar101 = (byte)(uVar99 >> 0x3b);
                auVar122 = in_ZMM13._0_16_;
                auVar128 = vcvtusi2ss_avx512f(auVar122,uVar112 >> bVar101 |
                                                       uVar112 << 0x20 - bVar101);
                auVar128 = vminss_avx(ZEXT416((uint)(auVar128._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar210 = ZEXT1664(auVar128);
                if ((float)local_7f8._0_4_ <= fVar130) {
                  fVar130 = (float)local_7f8._0_4_ - (float)local_878._0_4_;
                  local_48._0_4_ = fVar130 * (float)local_7e8._0_4_;
                  local_48._4_4_ = fVar130 * (float)local_7e8._4_4_;
                  local_48._8_4_ = fVar130 * (float)uStack_7e0;
                  local_48._12_4_ = fVar130 * uStack_7e0._4_4_;
                  auVar56._8_4_ = 0x3fb8aa3b;
                  auVar56._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar56._12_4_ = 0x3fb8aa3b;
                  auVar122 = vmulps_avx512vl(local_48,auVar56);
                  auVar128 = vroundps_avx(auVar122,9);
                  auVar122 = vsubps_avx(auVar122,auVar128);
                  auVar189._0_4_ = (int)auVar128._0_4_;
                  auVar189._4_4_ = (int)auVar128._4_4_;
                  auVar189._8_4_ = (int)auVar128._8_4_;
                  auVar189._12_4_ = (int)auVar128._12_4_;
                  auVar236._8_4_ = 0x3da00ac9;
                  auVar236._0_8_ = 0x3da00ac93da00ac9;
                  auVar236._12_4_ = 0x3da00ac9;
                  auVar57._8_4_ = 0x3e679a0b;
                  auVar57._0_8_ = 0x3e679a0b3e679a0b;
                  auVar57._12_4_ = 0x3e679a0b;
                  auVar128 = vfmadd213ps_avx512vl(auVar236,auVar122,auVar57);
                  auVar58._8_4_ = 0x3f321004;
                  auVar58._0_8_ = 0x3f3210043f321004;
                  auVar58._12_4_ = 0x3f321004;
                  auVar128 = vfmadd213ps_avx512vl(auVar128,auVar122,auVar58);
                  auVar89._4_4_ = uStack_7d4;
                  auVar89._0_4_ = local_7d8;
                  auVar89._8_4_ = uStack_7d0;
                  auVar89._12_4_ = uStack_7cc;
                  auVar122 = vfmadd213ps_fma(auVar128,auVar122,auVar89);
                  auVar120 = vpsrld_avx(auVar122,0x17);
                  auVar248._8_4_ = 0xffffff81;
                  auVar248._0_8_ = 0xffffff81ffffff81;
                  auVar248._12_4_ = 0xffffff81;
                  auVar128 = vpaddd_avx(auVar189,auVar248);
                  auVar128 = vpaddd_avx(auVar128,auVar120);
                  uVar100 = vpcmpgtd_avx512vl(auVar128,auVar248);
                  uVar100 = uVar100 & 0xf;
                  auVar59._8_4_ = 0x7f;
                  auVar59._0_8_ = 0x7f0000007f;
                  auVar59._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar128,auVar59);
                  uVar103 = uVar103 & 0xf;
                  auVar60._8_4_ = 0x807fffff;
                  auVar60._0_8_ = 0x807fffff807fffff;
                  auVar60._12_4_ = 0x807fffff;
                  auVar122 = vpandd_avx512vl(auVar122,auVar60);
                  auVar128 = vpslld_avx(auVar128,0x17);
                  auVar61._8_4_ = 0x3f800000;
                  auVar61._0_8_ = 0x3f8000003f800000;
                  auVar61._12_4_ = 0x3f800000;
                  auVar128 = vpaddd_avx512vl(auVar128,auVar61);
                  auVar128 = vpord_avx512vl(auVar128,auVar122);
                  auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar118 = (bool)((byte)uVar103 & 1);
                  local_58 = (float)((uint)bVar118 * auVar122._0_4_ |
                                    (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar128._0_4_);
                  bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
                  fStack_54 = (float)((uint)bVar118 * auVar122._4_4_ |
                                     (uint)!bVar118 *
                                     (uint)((byte)(uVar100 >> 1) & 1) * auVar128._4_4_);
                  bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
                  fStack_50 = (float)((uint)bVar118 * auVar122._8_4_ |
                                     (uint)!bVar118 *
                                     (uint)((byte)(uVar100 >> 2) & 1) * auVar128._8_4_);
                  bVar118 = SUB81(uVar103 >> 3,0);
                  fStack_4c = (float)((uint)bVar118 * auVar122._12_4_ |
                                     (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar128._12_4_);
                  local_6b8._4_4_ = fStack_54 * (float)local_6b8._4_4_;
                  local_6b8._0_4_ = local_58 * (float)local_6b8._0_4_;
                  uStack_6b0._0_4_ = fStack_50 * (float)uStack_6b0;
                  uStack_6b0._4_4_ = fStack_4c * uStack_6b0._4_4_;
                  cVar102 = '\n';
                  bVar118 = false;
                  local_68 = _local_7e8;
                }
                else if ((float)local_808._0_4_ <= fVar130) {
                  cVar102 = '\0';
                  bVar118 = true;
                  local_878 = ZEXT416((uint)fVar130);
                }
                else {
                  local_7a8._0_4_ = auVar128._0_4_;
                  fVar229 = fVar130 - (float)local_878._0_4_;
                  local_d8._0_4_ = fVar229 * (float)local_7e8._0_4_;
                  local_d8._4_4_ = fVar229 * (float)local_7e8._4_4_;
                  local_d8._8_4_ = fVar229 * (float)uStack_7e0;
                  local_d8._12_4_ = fVar229 * uStack_7e0._4_4_;
                  auVar50._8_4_ = 0x3fb8aa3b;
                  auVar50._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar50._12_4_ = 0x3fb8aa3b;
                  auVar128 = vmulps_avx512vl(local_d8,auVar50);
                  _local_6f8 = vroundps_avx(auVar128,9);
                  auVar128 = vsubps_avx(auVar128,_local_6f8);
                  auVar187._8_4_ = 0x3da00ac9;
                  auVar187._0_8_ = 0x3da00ac93da00ac9;
                  auVar187._12_4_ = 0x3da00ac9;
                  auVar51._8_4_ = 0x3e679a0b;
                  auVar51._0_8_ = 0x3e679a0b3e679a0b;
                  auVar51._12_4_ = 0x3e679a0b;
                  auVar120 = vfmadd213ps_avx512vl(auVar187,auVar128,auVar51);
                  auVar52._8_4_ = 0x3f321004;
                  auVar52._0_8_ = 0x3f3210043f321004;
                  auVar52._12_4_ = 0x3f321004;
                  auVar120 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar52);
                  auVar88._4_4_ = uStack_7d4;
                  auVar88._0_4_ = local_7d8;
                  auVar88._8_4_ = uStack_7d0;
                  auVar88._12_4_ = uStack_7cc;
                  local_6e8 = vfmadd213ps_fma(auVar120,auVar128,auVar88);
                  fVar131 = fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.x +
                            local_848.o.super_Tuple3<pbrt::Point3,_float>.x;
                  fVar167 = fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.y +
                            local_848.o.super_Tuple3<pbrt::Point3,_float>.y;
                  local_778 = CONCAT412(fVar130 * 0.0 + 0.0,
                                        CONCAT48(fVar130 * 0.0 + 0.0,CONCAT44(fVar167,fVar131)));
                  fVar229 = fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.z +
                            local_848.o.super_Tuple3<pbrt::Point3,_float>.z;
                  local_768._0_4_ = fVar229;
                  p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar229;
                  p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar131;
                  p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar167;
                  auVar170 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                  auVar228 = ZEXT856(local_778._8_8_);
                  local_628 = ZEXT416((uint)fVar130);
                  SVar284 = CloudMediumProvider::Density
                                      ((CloudMediumProvider *)*puVar105,p_00,pSVar104);
                  auVar218._0_8_ = SVar284.values.values._8_8_;
                  auVar218._8_56_ = auVar170;
                  auVar158._0_8_ = SVar284.values.values._0_8_;
                  auVar158._8_56_ = auVar228;
                  auVar128 = vmovshdup_avx(local_778);
                  fVar131 = auVar128._0_4_;
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 *
                                                           *(float *)((long)puVar105 + 0x7c))),
                                             local_778,ZEXT416(*(uint *)(puVar105 + 0xf)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_768._0_4_),
                                             ZEXT416(*(uint *)(puVar105 + 0x10)));
                  fVar130 = auVar128._0_4_ + *(float *)((long)puVar105 + 0x84);
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 *
                                                           *(float *)((long)puVar105 + 0x8c))),
                                             local_778,ZEXT416(*(uint *)(puVar105 + 0x11)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_768._0_4_),
                                             ZEXT416(*(uint *)(puVar105 + 0x12)));
                  fVar229 = auVar128._0_4_ + *(float *)((long)puVar105 + 0x94);
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 *
                                                           *(float *)((long)puVar105 + 0x9c))),
                                             local_778,ZEXT416(*(uint *)(puVar105 + 0x13)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_768._0_4_),
                                             ZEXT416(*(uint *)(puVar105 + 0x14)));
                  auVar120 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 *
                                                           *(float *)((long)puVar105 + 0xac))),
                                             local_778,ZEXT416(*(uint *)(puVar105 + 0x15)));
                  auVar120 = vfmadd231ss_fma(auVar120,ZEXT416((uint)local_768._0_4_),
                                             ZEXT416(*(uint *)(puVar105 + 0x16)));
                  fVar131 = auVar120._0_4_ + *(float *)((long)puVar105 + 0xb4);
                  bVar118 = fVar131 == 1.0;
                  local_458._0_4_ = auVar128._0_4_ + *(float *)((long)puVar105 + 0xa4);
                  auVar188._0_4_ = local_748._16_4_ * local_748._16_4_;
                  auVar188._4_4_ = local_748._20_4_ * local_748._20_4_;
                  auVar188._8_8_ = 0;
                  auVar128 = vmovshdup_avx(auVar188);
                  fVar167 = (float)local_748._12_4_ * (float)local_748._12_4_ + auVar188._0_4_ +
                            auVar128._0_4_;
                  if (fVar167 < 0.0) {
                    local_768 = ZEXT416((uint)fVar130);
                    local_3a8._0_16_ = auVar218._0_16_;
                    _local_448 = ZEXT416((uint)fVar229);
                    local_458 = ZEXT416((uint)local_458._0_4_);
                    local_468[0] = fVar131;
                    local_778 = auVar158._0_16_;
                    fVar167 = sqrtf(fVar167);
                    auVar128 = local_778;
                    auVar120 = local_768;
                    fVar229 = (float)local_448._0_4_;
                  }
                  else {
                    auVar128 = vsqrtss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                    fVar167 = auVar128._0_4_;
                    local_468[0] = fVar131;
                    auVar128 = auVar158._0_16_;
                    local_3a8._0_16_ = auVar218._0_16_;
                    auVar120 = ZEXT416((uint)fVar130);
                  }
                  auVar190._0_4_ = (int)(float)local_6f8._0_4_;
                  auVar190._4_4_ = (int)(float)local_6f8._4_4_;
                  auVar190._8_4_ = (int)fStack_6f0;
                  auVar190._12_4_ = (int)fStack_6ec;
                  auVar237 = vpsrld_avx(local_6e8,0x17);
                  auVar249._8_4_ = 0xffffff81;
                  auVar249._0_8_ = 0xffffff81ffffff81;
                  auVar249._12_4_ = 0xffffff81;
                  auVar136 = vpaddd_avx(auVar190,auVar249);
                  auVar136 = vpaddd_avx(auVar136,auVar237);
                  uVar100 = vpcmpgtd_avx512vl(auVar136,auVar249);
                  uVar100 = uVar100 & 0xf;
                  auVar53._8_4_ = 0x7f;
                  auVar53._0_8_ = 0x7f0000007f;
                  auVar53._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar136,auVar53);
                  uVar103 = uVar103 & 0xf;
                  auVar54._8_4_ = 0x807fffff;
                  auVar54._0_8_ = 0x807fffff807fffff;
                  auVar54._12_4_ = 0x807fffff;
                  auVar237 = vpandd_avx512vl(local_6e8,auVar54);
                  auVar136 = vpslld_avx(auVar136,0x17);
                  auVar55._8_4_ = 0x3f800000;
                  auVar55._0_8_ = 0x3f8000003f800000;
                  auVar55._12_4_ = 0x3f800000;
                  auVar136 = vpaddd_avx512vl(auVar136,auVar55);
                  auVar136 = vpord_avx512vl(auVar136,auVar237);
                  auVar237 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar12 = (bool)((byte)uVar103 & 1);
                  local_448._0_4_ =
                       (uint)bVar12 * auVar237._0_4_ |
                       (uint)!bVar12 * (uint)((byte)uVar100 & 1) * auVar136._0_4_;
                  bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
                  local_448._4_4_ =
                       (uint)bVar12 * auVar237._4_4_ |
                       (uint)!bVar12 * (uint)((byte)(uVar100 >> 1) & 1) * auVar136._4_4_;
                  bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
                  fStack_440 = (float)((uint)bVar12 * auVar237._8_4_ |
                                      (uint)!bVar12 *
                                      (uint)((byte)(uVar100 >> 2) & 1) * auVar136._8_4_);
                  bVar12 = SUB81(uVar103 >> 3,0);
                  fStack_43c = (float)((uint)bVar12 * auVar237._12_4_ |
                                      (uint)!bVar12 * (uint)(byte)(uVar100 >> 3) * auVar136._12_4_);
                  auVar136 = vmovlhps_avx(auVar128,local_3a8._0_16_);
                  auVar282._0_4_ = auVar136._0_4_ * local_338;
                  auVar282._4_4_ = auVar136._4_4_ * fStack_334;
                  auVar282._8_4_ = auVar136._8_4_ * fStack_330;
                  auVar282._12_4_ = auVar136._12_4_ * fStack_32c;
                  auVar237 = vshufpd_avx(auVar282,auVar282,1);
                  auVar238._0_4_ = auVar136._0_4_ * local_348;
                  auVar238._4_4_ = auVar136._4_4_ * fStack_344;
                  auVar238._8_4_ = auVar136._8_4_ * fStack_340;
                  auVar238._12_4_ = auVar136._12_4_ * fStack_33c;
                  auVar191 = vshufpd_avx(auVar238,auVar238,1);
                  local_538.values.values[0] = (float)local_448._0_4_ * (float)local_6b8._0_4_;
                  local_538.values.values[1] = (float)local_448._4_4_ * (float)local_6b8._4_4_;
                  local_538.values.values[2] = fStack_440 * (float)uStack_6b0;
                  local_538.values.values[3] = fStack_43c * uStack_6b0._4_4_;
                  auVar125._0_4_ =
                       (uint)bVar118 * (int)auVar120._0_4_ +
                       (uint)!bVar118 * (int)(auVar120._0_4_ / local_468[0]);
                  auVar125._4_12_ = auVar120._4_12_;
                  iVar108 = (uint)bVar118 * (int)fVar229 +
                            (uint)!bVar118 * (int)(fVar229 / local_468[0]);
                  iVar119 = (uint)bVar118 * local_458._0_4_ +
                            (uint)!bVar118 * (int)((float)local_458._0_4_ / local_468[0]);
                  auVar270._0_8_ = local_748._12_8_ ^ 0x8000000080000000;
                  auVar270._8_4_ = 0x80000000;
                  auVar270._12_4_ = 0x80000000;
                  auVar275._4_4_ = fVar167;
                  auVar275._0_4_ = fVar167;
                  auVar275._8_4_ = fVar167;
                  auVar275._12_4_ = fVar167;
                  auVar128 = vdivps_avx(auVar270,auVar275);
                  auVar276._0_4_ = -fStack_734;
                  auVar276._4_4_ = 0x80000000;
                  auVar276._8_4_ = 0x80000000;
                  auVar276._12_4_ = 0x80000000;
                  auVar140._0_4_ = auVar276._0_4_ / fVar167;
                  auVar140._4_12_ = auVar276._4_12_;
                  auVar261._4_4_ = iVar108;
                  auVar261._0_4_ = iVar108;
                  auVar261._8_4_ = iVar108;
                  auVar261._12_4_ = iVar108;
                  auVar265._4_4_ = iVar119;
                  auVar265._0_4_ = iVar119;
                  auVar265._8_4_ = iVar119;
                  auVar265._12_4_ = iVar119;
                  local_5d0._40_16_ = ZEXT816(0) << 0x20;
                  local_598 = 0.0;
                  local_5d0._0_16_ = vshufps_avx(auVar125,auVar261,0x40);
                  local_5d0._16_8_ = vmovlps_avx(auVar265);
                  local_5d0._24_4_ = FStack_730;
                  local_5d0._28_8_ = vmovlps_avx(auVar128);
                  local_590 = (MediumInterface *)0x0;
                  auVar150._16_16_ = auVar191;
                  auVar150._0_16_ = auVar140;
                  auVar205._16_16_ = auVar237;
                  auVar205._0_16_ = auVar140;
                  auVar151 = vperm2f128_avx(auVar205,auVar150,0x31);
                  local_3a8 = ZEXT1632(auVar282);
                  auVar206._16_16_ = auVar238;
                  auVar206._0_16_ = auVar282;
                  local_578 = vunpcklpd_avx(auVar206,auVar151);
                  local_558._16_16_ = local_5d0._40_16_;
                  local_558._0_16_ = local_4e8;
                  in_ZMM8 = ZEXT464((uint)FStack_730);
                  in_ZMM13 = ZEXT1664(auVar122);
                  local_5d0._36_4_ = auVar140._0_4_;
                  local_588.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                           )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                             )TVar9.bits;
                  local_580.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((long)puVar105 + 0x74U | 0x1000000000000);
                  local_468 = (float  [4])local_538.values.values;
                  local_458 = auVar136;
                  bVar118 = Li::anon_class_88_11_08f5f5b0::operator()
                                      ((anon_class_88_11_08f5f5b0 *)local_6a0,
                                       (MediumSample *)local_5d0);
                  local_878._0_4_ =
                       (uint)bVar118 * local_628._0_4_ + (uint)!bVar118 * local_878._0_4_;
                  cVar102 = !bVar118;
                  local_e8 = local_7e8;
                  uStack_e0 = uStack_7e0;
                  local_6b8._4_4_ = uStack_7d4;
                  local_6b8._0_4_ = local_7d8;
                  uStack_6b0._4_4_ = (float)uStack_7cc;
                  uStack_6b0._0_4_ = (float)uStack_7d0;
                  auVar210 = ZEXT464((uint)local_7a8._0_4_);
                  pSVar104 = local_780;
                }
              } while (cVar102 == '\0');
              if (cVar102 == '\n') {
                auVar272 = ZEXT1664(local_878);
                auVar128 = ZEXT416((uint)local_7f8._0_4_);
                goto LAB_003f7734;
              }
              auVar272 = ZEXT1664(local_878);
            }
            else {
              auVar42._8_4_ = 0x80000000;
              auVar42._0_8_ = 0x8000000080000000;
              auVar42._12_4_ = 0x80000000;
              local_138 = vxorps_avx512vl(local_4e8,auVar42);
              fVar130 = auVar128._0_4_ - auVar272._0_4_;
              local_148._0_4_ = fVar130 * local_138._0_4_;
              local_148._4_4_ = fVar130 * local_138._4_4_;
              local_148._8_4_ = fVar130 * local_138._8_4_;
              local_148._12_4_ = fVar130 * local_138._12_4_;
              auVar43._8_4_ = 0x3fb8aa3b;
              auVar43._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar43._12_4_ = 0x3fb8aa3b;
              auVar120 = vmulps_avx512vl(local_148,auVar43);
              auVar122 = vroundps_avx(auVar120,9);
              auVar120 = vsubps_avx(auVar120,auVar122);
              auVar186._0_4_ = (int)auVar122._0_4_;
              auVar186._4_4_ = (int)auVar122._4_4_;
              auVar186._8_4_ = (int)auVar122._8_4_;
              auVar186._12_4_ = (int)auVar122._12_4_;
              auVar235._8_4_ = 0x3da00ac9;
              auVar235._0_8_ = 0x3da00ac93da00ac9;
              auVar235._12_4_ = 0x3da00ac9;
              auVar44._8_4_ = 0x3e679a0b;
              auVar44._0_8_ = 0x3e679a0b3e679a0b;
              auVar44._12_4_ = 0x3e679a0b;
              auVar122 = vfmadd213ps_avx512vl(auVar235,auVar120,auVar44);
              auVar45._8_4_ = 0x3f321004;
              auVar45._0_8_ = 0x3f3210043f321004;
              auVar45._12_4_ = 0x3f321004;
              auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar45);
              auVar87._4_4_ = uStack_7d4;
              auVar87._0_4_ = local_7d8;
              auVar87._8_4_ = uStack_7d0;
              auVar87._12_4_ = uStack_7cc;
              auVar120 = vfmadd213ps_fma(auVar122,auVar120,auVar87);
              auVar136 = vpsrld_avx(auVar120,0x17);
              auVar247._8_4_ = 0xffffff81;
              auVar247._0_8_ = 0xffffff81ffffff81;
              auVar247._12_4_ = 0xffffff81;
              auVar122 = vpaddd_avx(auVar186,auVar247);
              auVar122 = vpaddd_avx(auVar122,auVar136);
              uVar100 = vpcmpgtd_avx512vl(auVar122,auVar247);
              uVar100 = uVar100 & 0xf;
              auVar46._8_4_ = 0x7f;
              auVar46._0_8_ = 0x7f0000007f;
              auVar46._12_4_ = 0x7f;
              uVar103 = vpcmpgtd_avx512vl(auVar122,auVar46);
              uVar103 = uVar103 & 0xf;
              auVar47._8_4_ = 0x807fffff;
              auVar47._0_8_ = 0x807fffff807fffff;
              auVar47._12_4_ = 0x807fffff;
              auVar120 = vpandd_avx512vl(auVar120,auVar47);
              auVar122 = vpslld_avx(auVar122,0x17);
              auVar48._8_4_ = 0x3f800000;
              auVar48._0_8_ = 0x3f8000003f800000;
              auVar48._12_4_ = 0x3f800000;
              auVar122 = vpaddd_avx512vl(auVar122,auVar48);
              auVar122 = vpord_avx512vl(auVar122,auVar120);
              auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar118 = (bool)((byte)uVar103 & 1);
              local_158 = (float)((uint)bVar118 * auVar120._0_4_ |
                                 (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar122._0_4_);
              bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
              fStack_154 = (float)((uint)bVar118 * auVar120._4_4_ |
                                  (uint)!bVar118 * (uint)((byte)(uVar100 >> 1) & 1) * auVar122._4_4_
                                  );
              bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
              fStack_150 = (float)((uint)bVar118 * auVar120._8_4_ |
                                  (uint)!bVar118 * (uint)((byte)(uVar100 >> 2) & 1) * auVar122._8_4_
                                  );
              bVar118 = SUB81(uVar103 >> 3,0);
              fStack_14c = (float)((uint)bVar118 * auVar120._12_4_ |
                                  (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar122._12_4_);
              local_6b8._4_4_ = fStack_154 * (float)local_6b8._4_4_;
              local_6b8._0_4_ = local_158 * (float)local_6b8._0_4_;
              uStack_6b0._0_4_ = fStack_150 * (float)uStack_6b0;
              uStack_6b0._4_4_ = fStack_14c * uStack_6b0._4_4_;
LAB_003f7734:
              if (((float)local_808._0_4_ < local_854[iVar106]) ||
                 (iVar108 = local_814[iVar106], local_814[iVar106] = iVar108 + aiStack_720[iVar106],
                 iVar108 + aiStack_720[iVar106] == aiStack_604[iVar106])) {
                bVar118 = false;
              }
              else {
                local_854[iVar106] = local_854[iVar106] + afStack_714[iVar106];
                bVar118 = true;
                auVar272 = ZEXT1664(auVar128);
              }
            }
            ray = local_618;
            this = local_750;
            sampler = (SamplerHandle *)local_610;
          } while (bVar118 != false);
        }
        else {
          local_6b8._4_4_ = uStack_7d4;
          local_6b8._0_4_ = local_7d8;
          uStack_6b0._4_4_ = (float)uStack_7cc;
          uStack_6b0._0_4_ = (float)uStack_7d0;
        }
      }
      else {
        local_748._0_8_ = vmovlps_avx(auVar122);
        unique0x000f4700 = vmovlhps_avx(auVar120,auVar128);
        local_6a0._0_8_ = &local_7c0;
        local_6a0._8_8_ = &local_708;
        local_6a0._16_8_ = &local_5e8;
        local_6a0._32_8_ = &local_87e;
        unique0x00005300 = &local_7bc;
        local_658 = &local_87d;
        local_650 = &local_790;
        local_87c = (float)local_878._0_4_;
        puVar105 = (undefined8 *)(TVar9.bits & 0xffffffffffff);
        local_748._8_4_ = fVar130;
        local_728.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar9.bits;
        Transform::ApplyInverse
                  (&local_848,(Transform *)(puVar105 + 0xf),(Ray *)local_748,&local_87c);
        auVar136._0_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar136._4_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar136._8_8_ = 0;
        auVar128 = vmovshdup_avx(auVar136);
        fVar130 = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x *
                  local_848.d.super_Tuple3<pbrt::Vector3,_float>.x + auVar136._0_4_ + auVar128._0_4_
        ;
        if (fVar130 < 0.0) {
          fVar130 = sqrtf(fVar130);
        }
        else {
          auVar128 = vsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
          fVar130 = auVar128._0_4_;
        }
        local_87c = fVar130 * local_87c;
        auVar237._0_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar237._4_4_ =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z *
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar237._8_8_ = 0;
        auVar128 = vmovshdup_avx(auVar237);
        fVar130 = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x *
                  local_848.d.super_Tuple3<pbrt::Vector3,_float>.x + auVar237._0_4_ + auVar128._0_4_
        ;
        if (fVar130 < 0.0) {
          fVar130 = sqrtf(fVar130);
        }
        else {
          auVar128 = vsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
          fVar130 = auVar128._0_4_;
        }
        auVar191._4_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar191._0_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar191._8_8_ = 0;
        auVar239._4_4_ = fVar130;
        auVar239._0_4_ = fVar130;
        auVar239._8_4_ = fVar130;
        auVar239._12_4_ = fVar130;
        auVar128 = vdivps_avx(auVar191,auVar239);
        uVar168 = vmovlps_avx(auVar128);
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar168;
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar168 >> 0x20);
        local_848.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_848.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar130;
        local_808._0_4_ = local_87c;
        auVar128 = ZEXT816(0) << 0x40;
        bVar118 = false;
        uVar112 = 0;
        do {
          pVVar113 = &local_848.d;
          if ((uVar112 != 0) &&
             (pVVar113 = (Vector3f *)((long)&local_848.d.super_Tuple3<pbrt::Vector3,_float> + 4),
             uVar112 != 1)) {
            pVVar113 = (Vector3f *)((long)&local_848.d.super_Tuple3<pbrt::Vector3,_float> + 8);
          }
          fVar130 = 1.0 / (pVVar113->super_Tuple3<pbrt::Vector3,_float>).x;
          pfVar114 = (float *)(puVar105 + 1);
          if ((uVar112 != 0) && (pfVar114 = (float *)((long)puVar105 + 0xc), uVar112 != 1)) {
            pfVar114 = (float *)(puVar105 + 2);
          }
          pRVar115 = &local_848;
          if ((uVar112 != 0) &&
             (pRVar115 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 4),
             uVar112 != 1)) {
            pRVar115 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 8);
          }
          pfVar109 = (float *)((long)puVar105 + 0x14);
          if ((uVar112 != 0) && (pfVar109 = (float *)(puVar105 + 3), uVar112 != 1)) {
            pfVar109 = (float *)((long)puVar105 + 0x1c);
          }
          pRVar116 = &local_848;
          if ((uVar112 != 0) &&
             (pRVar116 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 4),
             uVar112 != 1)) {
            pRVar116 = (Ray *)((long)&local_848.o.super_Tuple3<pbrt::Point3,_float> + 8);
          }
          auVar120 = ZEXT416((uint)(fVar130 *
                                   (*pfVar109 - (pRVar116->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar136 = ZEXT416((uint)(fVar130 *
                                   (*pfVar114 - (pRVar115->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar122 = vminss_avx(auVar120,auVar136);
          auVar128 = vmaxss_avx(auVar122,auVar128);
          auVar122 = vmaxss_avx(auVar136,auVar120);
          auVar122 = vminss_avx(ZEXT416((uint)(auVar122._0_4_ * 1.0000004)),
                                ZEXT416((uint)local_808._0_4_));
          auVar228 = ZEXT856(auVar122._8_8_);
          local_808._0_4_ = auVar122._0_4_;
          if (auVar122._0_4_ < auVar128._0_4_) break;
          bVar118 = 1 < uVar112;
          uVar112 = uVar112 + 1;
        } while (uVar112 != 3);
        if (bVar118) {
          uVar168 = 0;
          _local_6c8 = ZEXT416(*(uint *)(puVar105 + 0xe));
          local_878 = auVar128;
          SVar284 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(puVar105 + 4),pSVar104);
          auVar272._0_8_ = SVar284.values.values._8_8_;
          auVar272._8_56_ = auVar228;
          local_4f8._8_8_ = uVar168;
          local_4f8._0_8_ = SVar284.values.values._0_8_;
          _local_7f8 = auVar272._0_16_;
          auVar170 = (undefined1  [56])0x0;
          _local_7e8 = ZEXT416(*(uint *)(puVar105 + 0xe));
          SVar284 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(puVar105 + 9),pSVar104);
          auVar219._0_8_ = SVar284.values.values._8_8_;
          auVar219._8_56_ = auVar228;
          auVar210._0_8_ = SVar284.values.values._0_8_;
          auVar210._8_56_ = auVar170;
          auVar128 = vunpcklpd_avx(local_4f8,_local_7f8);
          local_368 = (float)local_6c8._0_4_ * auVar128._0_4_;
          fStack_364 = (float)local_6c8._0_4_ * auVar128._4_4_;
          fStack_360 = (float)local_6c8._0_4_ * auVar128._8_4_;
          fStack_35c = (float)local_6c8._0_4_ * auVar128._12_4_;
          auVar128 = vmovlhps_avx(auVar210._0_16_,auVar219._0_16_);
          local_358 = (float)local_7e8._0_4_ * auVar128._0_4_;
          fStack_354 = (float)local_7e8._0_4_ * auVar128._4_4_;
          fStack_350 = (float)local_7e8._0_4_ * auVar128._8_4_;
          fStack_34c = (float)local_7e8._0_4_ * auVar128._12_4_;
          local_408 = local_358 + local_368;
          fStack_404 = fStack_354 + fStack_364;
          fStack_400 = fStack_350 + fStack_360;
          fStack_3fc = fStack_34c + fStack_35c;
          fVar130 = *(float *)(puVar105 + 2);
          fVar167 = *(float *)((long)puVar105 + 0x1c) - fVar130;
          uVar168 = vcmpss_avx512f(ZEXT416((uint)fVar130),
                                   ZEXT416((uint)*(float *)((long)puVar105 + 0x1c)),1);
          bVar12 = (bool)((byte)uVar168 & 1);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = puVar105[1];
          auVar192._8_8_ = 0;
          auVar192._0_8_ = *(ulong *)((long)puVar105 + 0x14);
          auVar128 = vsubps_avx(auVar192,auVar141);
          auVar262._8_8_ = 0;
          auVar262._0_4_ = local_848.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar262._4_4_ = local_848.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar122 = vsubps_avx(auVar262,auVar141);
          uVar100 = vcmpps_avx512vl(auVar141,auVar192,1);
          auVar120 = vdivps_avx512vl(auVar122,auVar128);
          bVar118 = (bool)((byte)uVar100 & 1);
          auVar126._0_4_ = (float)((uint)bVar118 * auVar120._0_4_ | (uint)!bVar118 * auVar122._0_4_)
          ;
          bVar118 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar118 * auVar120._4_4_ | (uint)!bVar118 * auVar122._4_4_;
          bVar118 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar118 * auVar120._8_4_ | (uint)!bVar118 * auVar122._8_4_;
          bVar118 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar118 * auVar120._12_4_ | (uint)!bVar118 * auVar122._12_4_;
          auVar122 = vmovshdup_avx(auVar126);
          auVar142._4_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar142._0_4_ = local_848.d.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar142._8_8_ = 0;
          auVar128 = vdivps_avx(auVar142,auVar128);
          local_7ac = local_848.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar167;
          local_820 = vmovlps_avx(auVar128);
          uVar168 = local_820;
          auVar272 = ZEXT1664(local_878);
          fVar268 = local_878._0_4_;
          local_820._4_4_ = (float)((ulong)local_820 >> 0x20);
          fVar229 = fVar268 * (float)local_820 + auVar126._0_4_;
          fVar131 = fVar268 * local_820._4_4_ + auVar122._0_4_;
          fVar130 = (float)((uint)bVar12 *
                            (int)((local_848.o.super_Tuple3<pbrt::Point3,_float>.z - fVar130) /
                                 fVar167) +
                           (uint)!bVar12 *
                           (int)(local_848.o.super_Tuple3<pbrt::Point3,_float>.z - fVar130)) +
                    fVar268 * local_7ac;
          piVar1 = (int *)(puVar105 + 0x23);
          piVar2 = (int *)((long)puVar105 + 0x11c);
          piVar3 = (int *)(puVar105 + 0x24);
          lVar107 = 0;
          pfVar114 = (float *)((long)&local_820 + 4);
          auVar210 = ZEXT464((uint)local_7a8._0_4_);
          local_820 = uVar168;
          do {
            iVar106 = (int)lVar107;
            fVar167 = fVar229;
            if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
              fVar167 = fVar130;
            }
            piVar110 = piVar1;
            if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
              piVar110 = piVar3;
            }
            piVar111 = piVar1;
            if ((iVar106 != 0) && (piVar111 = piVar2, iVar106 != 1)) {
              piVar111 = piVar3;
            }
            auVar257._0_4_ = (float)(*piVar111 + -1);
            auVar257._4_12_ = in_ZMM8._4_12_;
            auVar128 = vminss_avx(auVar257,ZEXT416((uint)(fVar167 * (float)*piVar110)));
            uVar168 = vcmpss_avx512f(ZEXT416((uint)(fVar167 * (float)*piVar110)),ZEXT816(0) << 0x40,
                                     1);
            iVar108 = (int)(float)((uint)!(bool)((byte)uVar168 & 1) * auVar128._0_4_);
            local_814[lVar107] = iVar108;
            pfVar109 = (float *)&local_820;
            if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
              pfVar109 = &local_7ac;
            }
            if ((*pfVar109 == 0.0) && (!NAN(*pfVar109))) {
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              *pfVar109 = 0.0;
            }
            pfVar109 = (float *)&local_820;
            if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
              pfVar109 = &local_7ac;
            }
            if (0.0 <= *pfVar109) {
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              fVar167 = fVar229;
              if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
                fVar167 = fVar130;
              }
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              local_854[lVar107] =
                   fVar268 + ((float)(iVar108 + 1) / (float)*piVar110 - fVar167) / *pfVar109;
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              afStack_714[lVar107] = 1.0 / ((float)*piVar110 * *pfVar109);
              aiStack_720[lVar107] = 1;
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              iVar106 = *piVar110;
            }
            else {
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              fVar167 = fVar229;
              if ((iVar106 != 0) && (fVar167 = fVar131, iVar106 != 1)) {
                fVar167 = fVar130;
              }
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              local_854[lVar107] =
                   fVar268 + ((float)iVar108 / (float)*piVar110 - fVar167) / *pfVar109;
              pfVar109 = (float *)&local_820;
              if ((iVar106 != 0) && (pfVar109 = pfVar114, iVar106 != 1)) {
                pfVar109 = &local_7ac;
              }
              piVar110 = piVar1;
              if ((iVar106 != 0) && (piVar110 = piVar2, iVar106 != 1)) {
                piVar110 = piVar3;
              }
              afStack_714[lVar107] = -1.0 / ((float)*piVar110 * *pfVar109);
              aiStack_720[lVar107] = -1;
              iVar106 = -1;
            }
            aiStack_604[lVar107] = iVar106;
            lVar107 = lVar107 + 1;
          } while (lVar107 != 3);
          local_6c8._4_4_ = uStack_7d4;
          local_6c8._0_4_ = local_7d8;
          uStack_6c0._4_4_ = (float)uStack_7cc;
          uStack_6c0._0_4_ = (float)uStack_7d0;
          do {
            iVar106 = *(int *)(&DAT_005841e0 +
                              (ulong)((uint)(local_854[1] < local_854[2]) |
                                     (uint)(local_854[0] < local_854[1]) * 4 +
                                     (uint)(local_854[0] < local_854[2]) * 2) * 4);
            auVar97._4_4_ = fStack_404;
            auVar97._0_4_ = local_408;
            auVar97._8_4_ = fStack_400;
            auVar97._12_4_ = fStack_3fc;
            uVar4 = *(undefined4 *)
                     (puVar105[0x20] +
                     (((long)local_814[2] * (long)*(int *)((long)puVar105 + 0x11c) +
                      (long)local_814[1]) * (long)*(int *)(puVar105 + 0x23) + (long)local_814[0]) *
                     4);
            auVar62._4_4_ = uVar4;
            auVar62._0_4_ = uVar4;
            auVar62._8_4_ = uVar4;
            auVar62._12_4_ = uVar4;
            local_4f8 = vmulps_avx512vl(auVar97,auVar62);
            auVar128 = vminss_avx(ZEXT416((uint)local_854[iVar106]),ZEXT416((uint)local_808._0_4_));
            if ((local_4f8._0_4_ != 0.0) || (NAN(local_4f8._0_4_))) {
              local_7f8._0_4_ = auVar128._0_4_;
              local_878 = auVar272._0_16_;
              auVar70._8_4_ = 0x80000000;
              auVar70._0_8_ = 0x8000000080000000;
              auVar70._12_4_ = 0x80000000;
              _local_7e8 = vxorps_avx512vl(local_4f8,auVar70);
              do {
                fVar130 = logf(1.0 - auVar210._0_4_);
                uVar99 = local_790.state;
                fVar130 = (float)local_878._0_4_ - fVar130 / (float)local_4f8._0_4_;
                local_790.state = local_790.state * 0x5851f42d4c957f2d + local_790.inc;
                uVar112 = (uint)(uVar99 >> 0x2d) ^ (uint)(uVar99 >> 0x1b);
                bVar101 = (byte)(uVar99 >> 0x3b);
                auVar128 = vcvtusi2ss_avx512f(in_XMM15,uVar112 >> bVar101 |
                                                       uVar112 << 0x20 - bVar101);
                auVar128 = vminss_avx(ZEXT416((uint)(auVar128._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar210 = ZEXT1664(auVar128);
                if ((float)local_7f8._0_4_ <= fVar130) {
                  fVar130 = (float)local_7f8._0_4_ - (float)local_878._0_4_;
                  local_78._0_4_ = fVar130 * (float)local_7e8._0_4_;
                  local_78._4_4_ = fVar130 * (float)local_7e8._4_4_;
                  local_78._8_4_ = fVar130 * (float)uStack_7e0;
                  local_78._12_4_ = fVar130 * uStack_7e0._4_4_;
                  auVar77._8_4_ = 0x3fb8aa3b;
                  auVar77._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar77._12_4_ = 0x3fb8aa3b;
                  auVar122 = vmulps_avx512vl(local_78,auVar77);
                  auVar128 = vroundps_avx(auVar122,9);
                  auVar122 = vsubps_avx(auVar122,auVar128);
                  auVar197._0_4_ = (int)auVar128._0_4_;
                  auVar197._4_4_ = (int)auVar128._4_4_;
                  auVar197._8_4_ = (int)auVar128._8_4_;
                  auVar197._12_4_ = (int)auVar128._12_4_;
                  auVar241._8_4_ = 0x3da00ac9;
                  auVar241._0_8_ = 0x3da00ac93da00ac9;
                  auVar241._12_4_ = 0x3da00ac9;
                  auVar78._8_4_ = 0x3e679a0b;
                  auVar78._0_8_ = 0x3e679a0b3e679a0b;
                  auVar78._12_4_ = 0x3e679a0b;
                  auVar128 = vfmadd213ps_avx512vl(auVar241,auVar122,auVar78);
                  auVar79._8_4_ = 0x3f321004;
                  auVar79._0_8_ = 0x3f3210043f321004;
                  auVar79._12_4_ = 0x3f321004;
                  auVar128 = vfmadd213ps_avx512vl(auVar128,auVar122,auVar79);
                  auVar92._4_4_ = uStack_7d4;
                  auVar92._0_4_ = local_7d8;
                  auVar92._8_4_ = uStack_7d0;
                  auVar92._12_4_ = uStack_7cc;
                  auVar122 = vfmadd213ps_fma(auVar128,auVar122,auVar92);
                  auVar120 = vpsrld_avx(auVar122,0x17);
                  auVar251._8_4_ = 0xffffff81;
                  auVar251._0_8_ = 0xffffff81ffffff81;
                  auVar251._12_4_ = 0xffffff81;
                  auVar128 = vpaddd_avx(auVar197,auVar251);
                  auVar128 = vpaddd_avx(auVar128,auVar120);
                  uVar100 = vpcmpgtd_avx512vl(auVar128,auVar251);
                  uVar100 = uVar100 & 0xf;
                  auVar80._8_4_ = 0x7f;
                  auVar80._0_8_ = 0x7f0000007f;
                  auVar80._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar128,auVar80);
                  uVar103 = uVar103 & 0xf;
                  auVar81._8_4_ = 0x807fffff;
                  auVar81._0_8_ = 0x807fffff807fffff;
                  auVar81._12_4_ = 0x807fffff;
                  auVar122 = vpandd_avx512vl(auVar122,auVar81);
                  auVar128 = vpslld_avx(auVar128,0x17);
                  auVar82._8_4_ = 0x3f800000;
                  auVar82._0_8_ = 0x3f8000003f800000;
                  auVar82._12_4_ = 0x3f800000;
                  auVar128 = vpaddd_avx512vl(auVar128,auVar82);
                  auVar128 = vpord_avx512vl(auVar128,auVar122);
                  auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar118 = (bool)((byte)uVar103 & 1);
                  local_88 = (float)((uint)bVar118 * auVar122._0_4_ |
                                    (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar128._0_4_);
                  bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
                  fStack_84 = (float)((uint)bVar118 * auVar122._4_4_ |
                                     (uint)!bVar118 *
                                     (uint)((byte)(uVar100 >> 1) & 1) * auVar128._4_4_);
                  bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
                  fStack_80 = (float)((uint)bVar118 * auVar122._8_4_ |
                                     (uint)!bVar118 *
                                     (uint)((byte)(uVar100 >> 2) & 1) * auVar128._8_4_);
                  bVar118 = SUB81(uVar103 >> 3,0);
                  fStack_7c = (float)((uint)bVar118 * auVar122._12_4_ |
                                     (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar128._12_4_);
                  local_6c8._4_4_ = fStack_84 * (float)local_6c8._4_4_;
                  local_6c8._0_4_ = local_88 * (float)local_6c8._0_4_;
                  uStack_6c0._0_4_ = fStack_80 * (float)uStack_6c0;
                  uStack_6c0._4_4_ = fStack_7c * uStack_6c0._4_4_;
                  cVar102 = '\n';
                  bVar118 = false;
                  local_98 = _local_7e8;
                }
                else if ((float)local_808._0_4_ <= fVar130) {
                  cVar102 = '\0';
                  bVar118 = true;
                  local_878 = ZEXT416((uint)fVar130);
                }
                else {
                  local_7a8._0_4_ = auVar128._0_4_;
                  fVar229 = fVar130 - (float)local_878._0_4_;
                  local_f8._0_4_ = fVar229 * (float)local_7e8._0_4_;
                  local_f8._4_4_ = fVar229 * (float)local_7e8._4_4_;
                  local_f8._8_4_ = fVar229 * (float)uStack_7e0;
                  local_f8._12_4_ = fVar229 * uStack_7e0._4_4_;
                  auVar71._8_4_ = 0x3fb8aa3b;
                  auVar71._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar71._12_4_ = 0x3fb8aa3b;
                  auVar128 = vmulps_avx512vl(local_f8,auVar71);
                  _local_6f8 = vroundps_avx(auVar128,9);
                  auVar128 = vsubps_avx(auVar128,_local_6f8);
                  auVar194._8_4_ = 0x3da00ac9;
                  auVar194._0_8_ = 0x3da00ac93da00ac9;
                  auVar194._12_4_ = 0x3da00ac9;
                  auVar72._8_4_ = 0x3e679a0b;
                  auVar72._0_8_ = 0x3e679a0b3e679a0b;
                  auVar72._12_4_ = 0x3e679a0b;
                  auVar122 = vfmadd213ps_avx512vl(auVar194,auVar128,auVar72);
                  auVar73._8_4_ = 0x3f321004;
                  auVar73._0_8_ = 0x3f3210043f321004;
                  auVar73._12_4_ = 0x3f321004;
                  auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar73);
                  auVar91._4_4_ = uStack_7d4;
                  auVar91._0_4_ = local_7d8;
                  auVar91._8_4_ = uStack_7d0;
                  auVar91._12_4_ = uStack_7cc;
                  local_6e8 = vfmadd213ps_fma(auVar122,auVar128,auVar91);
                  auVar195._0_4_ =
                       fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.x +
                       local_848.o.super_Tuple3<pbrt::Point3,_float>.x;
                  auVar195._4_4_ =
                       fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.y +
                       local_848.o.super_Tuple3<pbrt::Point3,_float>.y;
                  auVar195._8_4_ = fVar130 * 0.0 + 0.0;
                  auVar195._12_4_ = fVar130 * 0.0 + 0.0;
                  auVar170 = ZEXT856(auVar195._8_8_);
                  local_860.super_Tuple3<pbrt::Point3,_float>.z =
                       fVar130 * local_848.d.super_Tuple3<pbrt::Vector3,_float>.z +
                       local_848.o.super_Tuple3<pbrt::Point3,_float>.z;
                  auVar228 = (undefined1  [56])0x0;
                  uVar168 = vmovlps_avx(auVar195);
                  local_860.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar168;
                  local_860.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar168 >> 0x20);
                  local_628 = ZEXT416((uint)fVar130);
                  SVar284 = NanoVDBMediumProvider::Density
                                      ((NanoVDBMediumProvider *)*puVar105,&local_860,pSVar104);
                  auVar220._0_8_ = SVar284.values.values._8_8_;
                  auVar220._8_56_ = auVar170;
                  auVar159._0_8_ = SVar284.values.values._0_8_;
                  auVar159._8_56_ = auVar228;
                  local_768 = auVar159._0_16_;
                  local_778 = auVar220._0_16_;
                  SVar284 = NanoVDBMediumProvider::Le
                                      ((NanoVDBMediumProvider *)*puVar105,&local_860,pSVar104);
                  auVar221._0_8_ = SVar284.values.values._8_8_;
                  auVar221._8_56_ = auVar170;
                  auVar160._0_8_ = SVar284.values.values._0_8_;
                  auVar160._8_56_ = auVar228;
                  _local_478 = auVar221._0_16_;
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0x7c))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0xf)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x10)));
                  fVar130 = auVar128._0_4_ + *(float *)((long)puVar105 + 0x84);
                  local_488 = ZEXT416((uint)fVar130);
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0x8c))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0x11)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x12)));
                  local_498[0] = auVar128._0_4_ + *(float *)((long)puVar105 + 0x94);
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0x9c))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0x13)));
                  auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x14)));
                  auVar122 = vfmadd231ss_fma(ZEXT416((uint)(local_860.
                                                            super_Tuple3<pbrt::Point3,_float>.y *
                                                           *(float *)((long)puVar105 + 0xac))),
                                             ZEXT416((uint)local_860.
                                                           super_Tuple3<pbrt::Point3,_float>.x),
                                             ZEXT416(*(uint *)(puVar105 + 0x15)));
                  auVar122 = vfmadd231ss_fma(auVar122,ZEXT416((uint)local_860.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                             ZEXT416(*(uint *)(puVar105 + 0x16)));
                  fVar229 = auVar122._0_4_ + *(float *)((long)puVar105 + 0xb4);
                  bVar118 = fVar229 == 1.0;
                  fVar131 = auVar128._0_4_ + *(float *)((long)puVar105 + 0xa4);
                  auVar196._0_4_ = local_748._16_4_ * local_748._16_4_;
                  auVar196._4_4_ = local_748._20_4_ * local_748._20_4_;
                  auVar196._8_8_ = 0;
                  auVar128 = vmovshdup_avx(auVar196);
                  fVar167 = (float)local_748._12_4_ * (float)local_748._12_4_ + auVar196._0_4_ +
                            auVar128._0_4_;
                  if (fVar167 < 0.0) {
                    local_3c8._0_16_ = auVar160._0_16_;
                    local_488 = ZEXT416((uint)fVar130);
                    local_498 = (float  [4])ZEXT416((uint)local_498[0]);
                    local_528 = ZEXT416((uint)fVar131);
                    local_5f8._0_4_ = fVar229;
                    fVar130 = sqrtf(fVar167);
                    fVar229 = (float)local_5f8._0_4_;
                    auVar128 = _local_478;
                    fVar131 = (float)local_528._0_4_;
                  }
                  else {
                    auVar128 = vsqrtss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                    fVar130 = auVar128._0_4_;
                    local_3c8._0_16_ = auVar160._0_16_;
                    auVar128 = _local_478;
                  }
                  auVar198._0_4_ = (int)(float)local_6f8._0_4_;
                  auVar198._4_4_ = (int)(float)local_6f8._4_4_;
                  auVar198._8_4_ = (int)fStack_6f0;
                  auVar198._12_4_ = (int)fStack_6ec;
                  auVar120 = vpsrld_avx(local_6e8,0x17);
                  auVar252._8_4_ = 0xffffff81;
                  auVar252._0_8_ = 0xffffff81ffffff81;
                  auVar252._12_4_ = 0xffffff81;
                  auVar122 = vpaddd_avx(auVar198,auVar252);
                  auVar122 = vpaddd_avx(auVar122,auVar120);
                  uVar100 = vpcmpgtd_avx512vl(auVar122,auVar252);
                  uVar100 = uVar100 & 0xf;
                  auVar74._8_4_ = 0x7f;
                  auVar74._0_8_ = 0x7f0000007f;
                  auVar74._12_4_ = 0x7f;
                  uVar103 = vpcmpgtd_avx512vl(auVar122,auVar74);
                  uVar103 = uVar103 & 0xf;
                  auVar75._8_4_ = 0x807fffff;
                  auVar75._0_8_ = 0x807fffff807fffff;
                  auVar75._12_4_ = 0x807fffff;
                  auVar120 = vpandd_avx512vl(local_6e8,auVar75);
                  auVar122 = vpslld_avx(auVar122,0x17);
                  auVar76._8_4_ = 0x3f800000;
                  auVar76._0_8_ = 0x3f8000003f800000;
                  auVar76._12_4_ = 0x3f800000;
                  auVar122 = vpaddd_avx512vl(auVar122,auVar76);
                  auVar122 = vpord_avx512vl(auVar122,auVar120);
                  auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar12 = (bool)((byte)uVar103 & 1);
                  local_478._0_4_ =
                       (uint)bVar12 * auVar120._0_4_ |
                       (uint)!bVar12 * (uint)((byte)uVar100 & 1) * auVar122._0_4_;
                  bVar12 = (bool)((byte)(uVar103 >> 1) & 1);
                  local_478._4_4_ =
                       (uint)bVar12 * auVar120._4_4_ |
                       (uint)!bVar12 * (uint)((byte)(uVar100 >> 1) & 1) * auVar122._4_4_;
                  bVar12 = (bool)((byte)(uVar103 >> 2) & 1);
                  fStack_470 = (float)((uint)bVar12 * auVar120._8_4_ |
                                      (uint)!bVar12 *
                                      (uint)((byte)(uVar100 >> 2) & 1) * auVar122._8_4_);
                  bVar12 = SUB81(uVar103 >> 3,0);
                  fStack_46c = (float)((uint)bVar12 * auVar120._12_4_ |
                                      (uint)!bVar12 * (uint)(byte)(uVar100 >> 3) * auVar122._12_4_);
                  auVar120 = vmovlhps_avx(local_768,local_778);
                  auVar283._0_4_ = auVar120._0_4_ * local_368;
                  auVar283._4_4_ = auVar120._4_4_ * fStack_364;
                  auVar283._8_4_ = auVar120._8_4_ * fStack_360;
                  auVar283._12_4_ = auVar120._12_4_ * fStack_35c;
                  auVar136 = vshufpd_avx(auVar283,auVar283,1);
                  auVar242._0_4_ = auVar120._0_4_ * local_358;
                  auVar242._4_4_ = auVar120._4_4_ * fStack_354;
                  auVar242._8_4_ = auVar120._8_4_ * fStack_350;
                  auVar242._12_4_ = auVar120._12_4_ * fStack_34c;
                  auVar237 = vshufpd_avx(auVar242,auVar242,1);
                  local_538.values.values[0] = (float)local_478._0_4_ * (float)local_6c8._0_4_;
                  local_538.values.values[1] = (float)local_478._4_4_ * (float)local_6c8._4_4_;
                  local_538.values.values[2] = fStack_470 * (float)uStack_6c0;
                  local_538.values.values[3] = fStack_46c * uStack_6c0._4_4_;
                  auVar127._0_4_ =
                       (uint)bVar118 * (int)local_488._0_4_ +
                       (uint)!bVar118 * (int)(local_488._0_4_ / fVar229);
                  auVar127._4_12_ = local_488._4_12_;
                  iVar108 = (uint)bVar118 * (int)local_498[0] +
                            (uint)!bVar118 * (int)(local_498[0] / fVar229);
                  iVar119 = (uint)bVar118 * (int)fVar131 + (uint)!bVar118 * (int)(fVar131 / fVar229)
                  ;
                  auVar271._0_8_ = local_748._12_8_ ^ 0x8000000080000000;
                  auVar271._8_4_ = 0x80000000;
                  auVar271._12_4_ = 0x80000000;
                  auVar277._4_4_ = fVar130;
                  auVar277._0_4_ = fVar130;
                  auVar277._8_4_ = fVar130;
                  auVar277._12_4_ = fVar130;
                  auVar122 = vdivps_avx(auVar271,auVar277);
                  auVar278._0_4_ = -fStack_734;
                  auVar278._4_4_ = 0x80000000;
                  auVar278._8_4_ = 0x80000000;
                  auVar278._12_4_ = 0x80000000;
                  auVar143._0_4_ = auVar278._0_4_ / fVar130;
                  auVar143._4_12_ = auVar278._4_12_;
                  auVar263._4_4_ = iVar108;
                  auVar263._0_4_ = iVar108;
                  auVar263._8_4_ = iVar108;
                  auVar263._12_4_ = iVar108;
                  auVar266._4_4_ = iVar119;
                  auVar266._0_4_ = iVar119;
                  auVar266._8_4_ = iVar119;
                  auVar266._12_4_ = iVar119;
                  local_5d0._40_16_ = ZEXT816(0) << 0x20;
                  local_598 = 0.0;
                  local_5d0._0_16_ = vshufps_avx(auVar127,auVar263,0x40);
                  local_5d0._16_8_ = vmovlps_avx(auVar266);
                  local_5d0._24_4_ = FStack_730;
                  local_5d0._28_8_ = vmovlps_avx(auVar122);
                  local_590 = (MediumInterface *)0x0;
                  auVar151._16_16_ = auVar237;
                  auVar151._0_16_ = auVar143;
                  auVar207._16_16_ = auVar136;
                  auVar207._0_16_ = auVar143;
                  auVar151 = vperm2f128_avx(auVar207,auVar151,0x31);
                  auVar208._16_16_ = auVar242;
                  auVar208._0_16_ = auVar283;
                  local_578 = vunpcklpd_avx(auVar208,auVar151);
                  local_558._16_16_ = vmovlhps_avx(local_3c8._0_16_,auVar128);
                  local_558._0_16_ = local_4f8;
                  in_ZMM8 = ZEXT464((uint)FStack_730);
                  in_ZMM13 = ZEXT1664(auVar128);
                  local_5d0._36_4_ = auVar143._0_4_;
                  local_588.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                           )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                             )((ulong)puVar105 | 0x4000000000000);
                  local_580.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       (TaggedPointer<pbrt::HGPhaseFunction>)
                       ((long)puVar105 + 0x74U | 0x1000000000000);
                  local_498 = (float  [4])local_538.values.values;
                  local_488 = auVar120;
                  local_3c8 = ZEXT1632(auVar283);
                  bVar118 = Li::anon_class_88_11_08f5f5b0::operator()
                                      ((anon_class_88_11_08f5f5b0 *)local_6a0,
                                       (MediumSample *)local_5d0);
                  local_878._0_4_ =
                       (uint)bVar118 * local_628._0_4_ + (uint)!bVar118 * local_878._0_4_;
                  cVar102 = !bVar118;
                  local_118 = local_7e8;
                  uStack_110 = uStack_7e0;
                  local_6c8._4_4_ = uStack_7d4;
                  local_6c8._0_4_ = local_7d8;
                  uStack_6c0._4_4_ = (float)uStack_7cc;
                  uStack_6c0._0_4_ = (float)uStack_7d0;
                  auVar210 = ZEXT464((uint)local_7a8._0_4_);
                  pSVar104 = local_780;
                }
              } while (cVar102 == '\0');
              if (cVar102 == '\n') {
                auVar272 = ZEXT1664(local_878);
                auVar128 = ZEXT416((uint)local_7f8._0_4_);
                goto LAB_003f84e1;
              }
              auVar272 = ZEXT1664(local_878);
            }
            else {
              auVar63._8_4_ = 0x80000000;
              auVar63._0_8_ = 0x8000000080000000;
              auVar63._12_4_ = 0x80000000;
              local_168 = vxorps_avx512vl(local_4f8,auVar63);
              fVar130 = auVar128._0_4_ - auVar272._0_4_;
              local_178._0_4_ = fVar130 * local_168._0_4_;
              local_178._4_4_ = fVar130 * local_168._4_4_;
              local_178._8_4_ = fVar130 * local_168._8_4_;
              local_178._12_4_ = fVar130 * local_168._12_4_;
              auVar64._8_4_ = 0x3fb8aa3b;
              auVar64._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar64._12_4_ = 0x3fb8aa3b;
              auVar120 = vmulps_avx512vl(local_178,auVar64);
              auVar122 = vroundps_avx(auVar120,9);
              auVar120 = vsubps_avx(auVar120,auVar122);
              auVar193._0_4_ = (int)auVar122._0_4_;
              auVar193._4_4_ = (int)auVar122._4_4_;
              auVar193._8_4_ = (int)auVar122._8_4_;
              auVar193._12_4_ = (int)auVar122._12_4_;
              auVar240._8_4_ = 0x3da00ac9;
              auVar240._0_8_ = 0x3da00ac93da00ac9;
              auVar240._12_4_ = 0x3da00ac9;
              auVar65._8_4_ = 0x3e679a0b;
              auVar65._0_8_ = 0x3e679a0b3e679a0b;
              auVar65._12_4_ = 0x3e679a0b;
              auVar122 = vfmadd213ps_avx512vl(auVar240,auVar120,auVar65);
              auVar66._8_4_ = 0x3f321004;
              auVar66._0_8_ = 0x3f3210043f321004;
              auVar66._12_4_ = 0x3f321004;
              auVar122 = vfmadd213ps_avx512vl(auVar122,auVar120,auVar66);
              auVar90._4_4_ = uStack_7d4;
              auVar90._0_4_ = local_7d8;
              auVar90._8_4_ = uStack_7d0;
              auVar90._12_4_ = uStack_7cc;
              auVar120 = vfmadd213ps_fma(auVar122,auVar120,auVar90);
              auVar136 = vpsrld_avx(auVar120,0x17);
              auVar250._8_4_ = 0xffffff81;
              auVar250._0_8_ = 0xffffff81ffffff81;
              auVar250._12_4_ = 0xffffff81;
              auVar122 = vpaddd_avx(auVar193,auVar250);
              auVar122 = vpaddd_avx(auVar122,auVar136);
              uVar100 = vpcmpgtd_avx512vl(auVar122,auVar250);
              uVar100 = uVar100 & 0xf;
              auVar67._8_4_ = 0x7f;
              auVar67._0_8_ = 0x7f0000007f;
              auVar67._12_4_ = 0x7f;
              uVar103 = vpcmpgtd_avx512vl(auVar122,auVar67);
              uVar103 = uVar103 & 0xf;
              auVar68._8_4_ = 0x807fffff;
              auVar68._0_8_ = 0x807fffff807fffff;
              auVar68._12_4_ = 0x807fffff;
              auVar120 = vpandd_avx512vl(auVar120,auVar68);
              auVar122 = vpslld_avx(auVar122,0x17);
              auVar69._8_4_ = 0x3f800000;
              auVar69._0_8_ = 0x3f8000003f800000;
              auVar69._12_4_ = 0x3f800000;
              auVar122 = vpaddd_avx512vl(auVar122,auVar69);
              auVar122 = vpord_avx512vl(auVar122,auVar120);
              auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar118 = (bool)((byte)uVar103 & 1);
              local_188 = (float)((uint)bVar118 * auVar120._0_4_ |
                                 (uint)!bVar118 * (uint)((byte)uVar100 & 1) * auVar122._0_4_);
              bVar118 = (bool)((byte)(uVar103 >> 1) & 1);
              fStack_184 = (float)((uint)bVar118 * auVar120._4_4_ |
                                  (uint)!bVar118 * (uint)((byte)(uVar100 >> 1) & 1) * auVar122._4_4_
                                  );
              bVar118 = (bool)((byte)(uVar103 >> 2) & 1);
              fStack_180 = (float)((uint)bVar118 * auVar120._8_4_ |
                                  (uint)!bVar118 * (uint)((byte)(uVar100 >> 2) & 1) * auVar122._8_4_
                                  );
              bVar118 = SUB81(uVar103 >> 3,0);
              fStack_17c = (float)((uint)bVar118 * auVar120._12_4_ |
                                  (uint)!bVar118 * (uint)(byte)(uVar100 >> 3) * auVar122._12_4_);
              local_6c8._4_4_ = fStack_184 * (float)local_6c8._4_4_;
              local_6c8._0_4_ = local_188 * (float)local_6c8._0_4_;
              uStack_6c0._0_4_ = fStack_180 * (float)uStack_6c0;
              uStack_6c0._4_4_ = fStack_17c * uStack_6c0._4_4_;
LAB_003f84e1:
              if (((float)local_808._0_4_ < local_854[iVar106]) ||
                 (iVar108 = local_814[iVar106], local_814[iVar106] = iVar108 + aiStack_720[iVar106],
                 iVar108 + aiStack_720[iVar106] == aiStack_604[iVar106])) {
                bVar118 = false;
              }
              else {
                local_854[iVar106] = local_854[iVar106] + afStack_714[iVar106];
                bVar118 = true;
                auVar272 = ZEXT1664(auVar128);
              }
            }
            ray = local_618;
            this = local_750;
            sampler = (SamplerHandle *)local_610;
          } while (bVar118 != false);
        }
        else {
          local_6c8._4_4_ = uStack_7d4;
          local_6c8._0_4_ = local_7d8;
          uStack_6c0._4_4_ = (float)uStack_7cc;
          uStack_6c0._0_4_ = (float)uStack_7d0;
        }
      }
      auVar210 = ZEXT3264(local_648);
      this_03 = local_7b8;
    }
LAB_003f8890:
    pSVar104 = local_780;
    if (local_87e == false) {
      bVar118 = false;
      if (local_87d == false) {
        local_648 = auVar210._0_32_;
        if ((byte)local_228 == '\x01') {
          auVar202._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar202._4_4_ = 0x80000000;
          auVar202._8_4_ = 0x80000000;
          auVar202._12_4_ = 0x80000000;
          uVar103._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar103._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar145._0_8_ = uVar103 ^ 0x8000000080000000;
          auVar145._8_4_ = 0x80000000;
          auVar145._12_4_ = 0x80000000;
          in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
          w.super_Tuple3<pbrt::Vector3,_float>.z = auVar202._0_4_;
          w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar145._0_8_;
          w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar145._0_8_ >> 0x20);
          auVar170 = ZEXT856(auVar202._8_8_);
          auVar228 = ZEXT856(auVar145._8_8_);
          SVar284 = SurfaceInteraction::Le((SurfaceInteraction *)&local_328.__align,w,local_780);
          auVar223._0_8_ = SVar284.values.values._8_8_;
          auVar223._8_56_ = auVar170;
          auVar162._0_8_ = SVar284.values.values._0_8_;
          auVar162._8_56_ = auVar228;
          auVar128 = vmovlhps_avx(auVar162._0_16_,auVar223._0_16_);
          auVar146._0_4_ = auVar128._0_4_ * local_5e8.values.values[0];
          auVar146._4_4_ = auVar128._4_4_ * local_5e8.values.values[1];
          auVar146._8_4_ = auVar128._8_4_ * local_5e8.values.values[2];
          auVar146._12_4_ = auVar128._12_4_ * local_5e8.values.values[3];
          auVar128 = *(undefined1 (*) [16])(pSVar104->pdf).values;
          uVar100 = vcmpps_avx512vl(auVar128,_DAT_00565010,4);
          auVar128 = vdivps_avx512vl(auVar146,auVar128);
          local_708.values.values[0] =
               (float)((uint)((byte)uVar100 & 1) * auVar128._0_4_) + local_708.values.values[0];
          local_708.values.values[1] =
               (float)((uint)((byte)(uVar100 >> 1) & 1) * auVar128._4_4_) +
               local_708.values.values[1];
          local_708.values.values[2] =
               (float)((uint)((byte)(uVar100 >> 2) & 1) * auVar128._8_4_) +
               local_708.values.values[2];
          local_708.values.values[3] =
               (float)((uint)((byte)(uVar100 >> 3) & 1) * auVar128._12_4_) +
               local_708.values.values[3];
          if ((byte)local_228 == '\0') {
LAB_003f8ce6:
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
          }
          local_510.bits =
               (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
               super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               .bits;
          local_518 = *(Interval *)sampler;
          SurfaceInteraction::GetBSDF
                    ((BSDF *)local_5d0,(SurfaceInteraction *)&local_328.__align,ray,pSVar104,
                     (CameraHandle *)&local_510,local_4d0,(SamplerHandle *)&local_518);
          if ((local_5d0._0_16_ & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
            if ((byte)local_228 != '\x01') goto LAB_003f8ce6;
            bVar118 = false;
            SurfaceInteraction::SkipIntersection
                      ((SurfaceInteraction *)&local_328.__align,ray,(Float)local_328._248_4_);
            auVar210 = ZEXT3264(local_648);
          }
          else {
            local_6a0._0_8_ = *sampler;
            FVar129 = DispatchSplit<9>::operator()
                                ((DispatchSplit<9> *)&local_848,
                                 (optional<pbrt::BSDFSample> *)local_6a0,
                                 (ulong)local_6a0._0_8_ >> 0x30);
            local_878._0_4_ = FVar129;
            IVar10 = *(Interval *)sampler;
            this_00 = (DebugMLTSampler *)((ulong)IVar10 & 0xffffffffffff);
            sVar83 = IVar10.high._2_2_;
            if ((ulong)IVar10 >> 0x30 < 5) {
              if ((ulong)IVar10 < 0x3000000000000) {
                if (sVar83 == 2) {
                  u2 = (Tuple2<pbrt::Point2,_float>)
                       StratifiedSampler::Get2D((StratifiedSampler *)this_00);
                }
                else {
                  u2 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)this_00);
                }
              }
              else if (sVar83 == 3) {
                u2 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)this_00);
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)
                     PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
              }
            }
            else if ((ulong)IVar10 < 0x7000000000000) {
              if (sVar83 == 6) {
                u2 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)this_00);
              }
              else {
                u2 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)this_00);
              }
            }
            else if ((ulong)IVar10 >> 0x30 == 8) {
              u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)this_00);
            }
            else if (sVar83 == 7) {
              u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_00);
            }
            else {
              local_7a8._0_4_ = DebugMLTSampler::Get1D(this_00);
              local_7a8._4_4_ = extraout_XMM0_Db;
              local_7a8._8_4_ = extraout_XMM0_Dc;
              local_7a8._12_4_ = extraout_XMM0_Dd;
              auVar166._0_4_ = DebugMLTSampler::Get1D(this_00);
              auVar166._4_60_ = extraout_var_02;
              auVar128 = vinsertps_avx(local_7a8,auVar166._0_16_,0x10);
              u2 = auVar128._0_8_;
            }
            uVar6 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
            uVar8 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
            auVar148._4_4_ = uVar8;
            auVar148._0_4_ = uVar6;
            auVar243._8_4_ = 0x80000000;
            auVar243._0_8_ = 0x8000000080000000;
            auVar243._12_4_ = 0x80000000;
            auVar148._8_8_ = 0;
            woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB168(auVar148 ^ auVar243,0);
            woRender.super_Tuple3<pbrt::Vector3,_float>.z =
                 SUB164(ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z) ^
                        auVar243,0);
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_6a0,(BSDF *)local_5d0,woRender,
                           (Float)local_878._0_4_,(Point2f)u2,Radiance,All);
            auVar210 = ZEXT3264(local_648);
            if (bStack_674 == true) {
              ErrorExit<>("SimpleVolPathIntegrator doesn\'t support surface scattering.");
            }
            bVar118 = true;
          }
        }
        else {
          pLVar117 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                     infiniteLights.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pLVar11 = *(pointer *)
                     ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                             infiniteLights.
                             super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                             ._M_impl.super__Vector_impl_data + 8);
          if (pLVar117 == pLVar11) {
            bVar118 = true;
            this_03 = local_7b8;
            this = local_750;
          }
          else {
            do {
              uVar100 = (pLVar117->
                        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                        ).bits;
              auVar128 = ZEXT816(0) << 0x40;
              auVar122 = ZEXT816(0) << 0x40;
              if (0x6ffffffffffff < uVar100) {
                this_01 = (ImageInfiniteLight *)(uVar100 & 0xffffffffffff);
                auVar128 = in_ZMM8._0_16_;
                auVar122 = in_ZMM13._0_16_;
                if (uVar100 >> 0x30 == 8) {
                  auVar228 = ZEXT856(0);
                  auVar170 = ZEXT856(0);
                  in_ZMM8 = ZEXT1664(auVar128);
                  in_ZMM13 = ZEXT1664(auVar122);
                  SVar284 = ImageInfiniteLight::Le(this_01,&ray->super_Ray,pSVar104);
                  auVar225._0_8_ = SVar284.values.values._8_8_;
                  auVar225._8_56_ = auVar170;
                  auVar122 = auVar225._0_16_;
                  auVar164._0_8_ = SVar284.values.values._0_8_;
                  auVar164._8_56_ = auVar228;
                  auVar128 = auVar164._0_16_;
                }
                else if ((short)(uVar100 >> 0x30) == 7) {
                  auVar228 = ZEXT856(0);
                  auVar170 = ZEXT856(0);
                  in_ZMM8 = ZEXT1664(auVar128);
                  in_ZMM13 = ZEXT1664(auVar122);
                  SVar284 = UniformInfiniteLight::Le
                                      ((UniformInfiniteLight *)this_01,&ray->super_Ray,pSVar104);
                  auVar224._0_8_ = SVar284.values.values._8_8_;
                  auVar224._8_56_ = auVar170;
                  auVar122 = auVar224._0_16_;
                  auVar163._0_8_ = SVar284.values.values._0_8_;
                  auVar163._8_56_ = auVar228;
                  auVar128 = auVar163._0_16_;
                }
                else {
                  auVar228 = ZEXT856(0);
                  auVar170 = ZEXT856(0);
                  in_ZMM8 = ZEXT1664(auVar128);
                  in_ZMM13 = ZEXT1664(auVar122);
                  SVar284 = PortalImageInfiniteLight::Le
                                      ((PortalImageInfiniteLight *)this_01,&ray->super_Ray,pSVar104)
                  ;
                  auVar226._0_8_ = SVar284.values.values._8_8_;
                  auVar226._8_56_ = auVar170;
                  auVar122 = auVar226._0_16_;
                  auVar165._0_8_ = SVar284.values.values._0_8_;
                  auVar165._8_56_ = auVar228;
                  auVar128 = auVar165._0_16_;
                }
              }
              auVar128 = vmovlhps_avx(auVar128,auVar122);
              auVar147._0_4_ = auVar128._0_4_ * local_5e8.values.values[0];
              auVar147._4_4_ = auVar128._4_4_ * local_5e8.values.values[1];
              auVar147._8_4_ = auVar128._8_4_ * local_5e8.values.values[2];
              auVar147._12_4_ = auVar128._12_4_ * local_5e8.values.values[3];
              auVar128 = *(undefined1 (*) [16])(pSVar104->pdf).values;
              uVar100 = vcmpps_avx512vl(auVar128,_DAT_00565010,4);
              auVar128 = vdivps_avx512vl(auVar147,auVar128);
              local_708.values.values[0] =
                   (float)((uint)((byte)uVar100 & 1) * auVar128._0_4_) + local_708.values.values[0];
              local_708.values.values[1] =
                   (float)((uint)((byte)(uVar100 >> 1) & 1) * auVar128._4_4_) +
                   local_708.values.values[1];
              local_708.values.values[2] =
                   (float)((uint)((byte)(uVar100 >> 2) & 1) * auVar128._8_4_) +
                   local_708.values.values[2];
              local_708.values.values[3] =
                   (float)((uint)((byte)(uVar100 >> 3) & 1) * auVar128._12_4_) +
                   local_708.values.values[3];
              pLVar117 = pLVar117 + 1;
            } while (pLVar117 != pLVar11);
            bVar118 = true;
            auVar210 = ZEXT3264(local_648);
            this_03 = local_7b8;
            this = local_750;
          }
        }
      }
    }
    else {
      bVar118 = true;
    }
    if ((byte)local_228 == '\x01') {
      local_228 = local_228 & 0xffffffffffffff00;
    }
    if (bVar118) {
      aVar94.values[1] = local_708.values.values[1];
      aVar94.values[0] = local_708.values.values[0];
      aVar94.values[2] = local_708.values.values[2];
      aVar94.values[3] = local_708.values.values[3];
      return (array<float,_4>)(array<float,_4>)aVar94.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum SimpleVolPathIntegrator::Li(RayDifferential ray,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler, ScratchBuffer &buf,
                                            VisibleSurface *) const {
    SampledSpectrum L(0.f), beta(1.f);
    int numScatters = 0;
    // Terminate secondary wavelengths before starting random walk
    lambda.TerminateSecondary();

    while (true) {
        // Estimate radiance for ray path using delta tracking
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample medium scattering using delta tracking
            uint64_t hash0 = Hash(sampler.Get1D());
            uint64_t hash1 = Hash(sampler.Get1D());
            RNG rng(hash0, hash1);
            Float tMax = si ? si->tHit : Infinity;
            Float u = sampler.Get1D();
            Float uMode = sampler.Get1D();
            ray.medium.SampleTmaj(ray, tMax, u, rng, lambda, [&](const MediumSample &ms) {
                const MediumInteraction &intr = ms.intr;
                // Compute medium event probabilities for interaction
                Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                // Randomly sample medium scattering event for delta tracking
                int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, uMode);
                if (mode == 0) {
                    // Handle absorption event for delta tracking
                    L += SafeDiv(beta * intr.Le, lambda.PDF());
                    terminated = true;
                    return false;

                } else if (mode == 1) {
                    // Handle regular scattering event for delta tracking
                    // Stop path sampling if maximum depth has been reached
                    if (numScatters++ >= maxDepth) {
                        terminated = true;
                        return false;
                    }

                    // Sample phase function for delta tracking scattering event
                    pstd::optional<PhaseFunctionSample> ps =
                        intr.phase.Sample_p(-ray.d, sampler.Get2D());
                    if (!ps) {
                        terminated = true;
                        return false;
                    }

                    // Update state for recursive $L_\roman{i}$ evaluation
                    beta *= ps->p / ps->pdf;
                    ray = intr.SpawnRay(ps->wi);
                    scattered = true;
                    return false;

                } else {
                    // Handle null scattering event for delta tracking
                    uMode = rng.Uniform<Float>();
                    return true;
                }
            });
        }
        // Handle terminated and unscattered rays after medium sampling
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Add emission to un-scattered ray
        if (si)
            L += SafeDiv(beta * si->intr.Le(-ray.d, lambda), lambda.PDF());
        else {
            for (const auto &light : infiniteLights)
                L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            return L;
        }

        // Handle surface intersection along delta tracking path
        BSDF bsdf = si->intr.GetBSDF(ray, lambda, camera, buf, sampler);
        if (!bsdf)
            si->intr.SkipIntersection(&ray, si->tHit);
        else {
            Float uc = sampler.Get1D();
            Point2f u = sampler.Get2D();
            if (bsdf.Sample_f(-ray.d, uc, u))
                ErrorExit("SimpleVolPathIntegrator doesn't support surface scattering.");
            else
                break;
        }
    }
    return L;
}